

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O2

void Rasterizer::doRender<RasterizerA3<8u>>(RasterizerA3<8U> *self,uint32_t argb32)

{
  Cell *pCVar1;
  uint8_t *puVar2;
  Cell *pCVar3;
  int iVar4;
  Image *pIVar5;
  long lVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint32_t uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint32_t *puVar26;
  BitWord BVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  BitWord *pBVar33;
  Cell *pCVar34;
  uint8_t *puVar35;
  bool bVar36;
  short sVar37;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  short sVar46;
  undefined1 auVar39 [16];
  int iVar47;
  undefined4 uVar48;
  undefined1 auVar49 [12];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar63 [16];
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 in_XMM9 [16];
  undefined1 auVar64 [16];
  short sVar73;
  uint uVar72;
  undefined1 auVar65 [16];
  undefined1 auVar74 [12];
  undefined1 in_XMM10 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar93;
  short sVar94;
  short sVar102;
  short sVar104;
  short sVar106;
  short sVar108;
  short sVar110;
  short sVar112;
  short sVar114;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  short sVar103;
  short sVar105;
  short sVar107;
  short sVar109;
  short sVar111;
  short sVar113;
  short sVar115;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  short sVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  short sVar121;
  int iVar122;
  short sVar131;
  int iVar132;
  short sVar135;
  int iVar136;
  short sVar138;
  undefined1 in_XMM13 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  int iVar133;
  uint uVar139;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar130;
  short sVar134;
  short sVar137;
  short sVar141;
  int iVar140;
  undefined1 auVar129 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar54 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  short sVar60;
  undefined1 auVar79 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  ushort uVar90;
  short sVar91;
  ushort uVar92;
  
  uVar139 = (self->super_CellRasterizer).super_Rasterizer._options;
  if ((self->super_CellRasterizer).super_Rasterizer._fillMode != 1) {
    if ((uVar139 & 1) != 0) {
      pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
      lVar6 = pIVar5->_stride;
      uVar31 = (ulong)(self->_yBounds).start;
      iVar4 = (self->_yBounds).end;
      pBVar33 = self->_bits + self->_bitStride * uVar31;
      pCVar34 = self->_cells + self->_cellStride * uVar31;
      puVar35 = pIVar5->_data + lVar6 * uVar31;
      uVar17 = PixelUtils::premultiply(argb32);
      auVar16 = _DAT_001181c0;
      auVar15 = _DAT_00118190;
      auVar38._4_4_ = uVar17;
      auVar38._0_4_ = uVar17;
      auVar38._8_4_ = uVar17;
      auVar38._12_4_ = uVar17;
      auVar39 = pmovzxbw(in_XMM1,auVar38);
      auVar50 = pmovzxbw(in_XMM6,0x8080808080808080);
      auVar61 = pmovsxwd(in_XMM8,0x1ff01ff01ff01ff);
      auVar62 = pmovzxbw(in_XMM9,0xffffffffffffffff);
      for (; uVar31 <= (ulong)(long)iVar4; uVar31 = uVar31 + 1) {
        sVar19 = self->_bitStride;
        uVar139 = 0;
        uVar21 = 0;
        uVar20 = 0;
        do {
          BVar27 = *pBVar33;
          *pBVar33 = 0;
          uVar30 = uVar20 + 0x200;
          while( true ) {
            sVar37 = auVar39._0_2_;
            sVar40 = auVar39._2_2_;
            sVar41 = auVar39._4_2_;
            sVar42 = auVar39._6_2_;
            sVar43 = auVar39._8_2_;
            sVar44 = auVar39._10_2_;
            sVar45 = auVar39._12_2_;
            sVar46 = auVar39._14_2_;
            sVar94 = auVar50._0_2_;
            sVar103 = auVar50._2_2_;
            sVar105 = auVar50._4_2_;
            sVar107 = auVar50._6_2_;
            sVar109 = auVar50._8_2_;
            sVar111 = auVar50._10_2_;
            sVar113 = auVar50._12_2_;
            sVar115 = auVar50._14_2_;
            if (BVar27 == 0) break;
            lVar25 = 0;
            if (BVar27 != 0) {
              for (; (BVar27 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            uVar32 = -1L << ((byte)lVar25 & 0x3f);
            uVar23 = (uint)((int)lVar25 << 3) | uVar20;
            uVar24 = uVar21;
            if (uVar21 <= uVar23 && uVar23 - uVar21 != 0) {
              uVar22 = uVar139 & 0x1ff;
              uVar28 = uVar22 ^ 0x1ff;
              if (uVar22 < 0x100) {
                uVar28 = uVar22;
              }
              uVar24 = uVar23;
              if (uVar28 != 0) {
                uVar18 = uVar23 - uVar21 >> 2;
                if (uVar28 == 0xff) {
                  puVar26 = (uint32_t *)(puVar35 + uVar21 * 4);
                  for (; 7 < uVar18; uVar18 = uVar18 - 8) {
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x20) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x30) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x40) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x50) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x60) = auVar38;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x70) = auVar38;
                    uVar21 = uVar21 + 0x20;
                    puVar26 = puVar26 + 0x20;
                  }
                  for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar38;
                    uVar21 = uVar21 + 4;
                    puVar26 = puVar26 + 4;
                  }
                  for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
                    *puVar26 = uVar17;
                    puVar26 = puVar26 + 1;
                  }
                }
                else {
                  auVar63 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
                  auVar99._0_4_ = auVar63._0_4_;
                  auVar99._4_4_ = auVar99._0_4_;
                  auVar99._8_4_ = auVar99._0_4_;
                  auVar99._12_4_ = auVar99._0_4_;
                  sVar116 = auVar63._0_2_;
                  sVar60 = auVar63._2_2_;
                  auVar99 = auVar99 ^ _DAT_00118170;
                  sVar121 = sVar116 * sVar37 + 0x80;
                  sVar130 = sVar60 * sVar40 + 0x80;
                  sVar131 = sVar116 * sVar41 + 0x80;
                  sVar134 = sVar60 * sVar42 + 0x80;
                  sVar135 = sVar116 * sVar43 + 0x80;
                  sVar137 = sVar60 * sVar44 + 0x80;
                  sVar138 = sVar116 * sVar45 + 0x80;
                  sVar141 = sVar60 * sVar46 + 0x80;
                  while( true ) {
                    sVar93 = auVar99._0_2_;
                    sVar102 = auVar99._2_2_;
                    sVar104 = auVar99._4_2_;
                    sVar106 = auVar99._6_2_;
                    sVar108 = auVar99._8_2_;
                    sVar110 = auVar99._10_2_;
                    sVar112 = auVar99._12_2_;
                    sVar114 = auVar99._14_2_;
                    if (uVar18 < 2) break;
                    auVar63 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                    auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10);
                    auVar123 = pmovzxbw(in_XMM15,auVar63);
                    auVar95 = pmovzxbw(in_XMM2,auVar76);
                    auVar85._0_2_ = (ushort)auVar63[8] * sVar93 + sVar121;
                    auVar85._2_2_ = (ushort)auVar63[9] * sVar102 + sVar130;
                    auVar85._4_2_ = (ushort)auVar63[10] * sVar104 + sVar131;
                    auVar85._6_2_ = (ushort)auVar63[0xb] * sVar106 + sVar134;
                    auVar85._8_2_ = (ushort)auVar63[0xc] * sVar108 + sVar135;
                    auVar85._10_2_ = (ushort)auVar63[0xd] * sVar110 + sVar137;
                    auVar85._12_2_ = (ushort)auVar63[0xe] * sVar112 + sVar138;
                    auVar85._14_2_ = (ushort)auVar63[0xf] * sVar114 + sVar141;
                    in_XMM10 = pmulhuw(auVar85,auVar15);
                    auVar146._0_2_ = (ushort)auVar76[8] * sVar93 + sVar121;
                    auVar146._2_2_ = (ushort)auVar76[9] * sVar102 + sVar130;
                    auVar146._4_2_ = (ushort)auVar76[10] * sVar104 + sVar131;
                    auVar146._6_2_ = (ushort)auVar76[0xb] * sVar106 + sVar134;
                    auVar146._8_2_ = (ushort)auVar76[0xc] * sVar108 + sVar135;
                    auVar146._10_2_ = (ushort)auVar76[0xd] * sVar110 + sVar137;
                    auVar146._12_2_ = (ushort)auVar76[0xe] * sVar112 + sVar138;
                    auVar146._14_2_ = (ushort)auVar76[0xf] * sVar114 + sVar141;
                    auVar76 = pmulhuw(auVar146,auVar15);
                    auVar153._0_2_ = auVar123._0_2_ * sVar93 + sVar121;
                    auVar153._2_2_ = auVar123._2_2_ * sVar102 + sVar130;
                    auVar153._4_2_ = auVar123._4_2_ * sVar104 + sVar131;
                    auVar153._6_2_ = auVar123._6_2_ * sVar106 + sVar134;
                    auVar153._8_2_ = auVar123._8_2_ * sVar108 + sVar135;
                    auVar153._10_2_ = auVar123._10_2_ * sVar110 + sVar137;
                    auVar153._12_2_ = auVar123._12_2_ * sVar112 + sVar138;
                    auVar153._14_2_ = auVar123._14_2_ * sVar114 + sVar141;
                    auVar63 = pmulhuw(auVar153,auVar15);
                    sVar91 = auVar63._0_2_;
                    sVar66 = auVar63._2_2_;
                    in_XMM15[1] = (0 < sVar66) * (sVar66 < 0x100) * auVar63[2] - (0xff < sVar66);
                    in_XMM15[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[0] - (0xff < sVar91);
                    sVar91 = auVar63._4_2_;
                    in_XMM15[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[4] - (0xff < sVar91);
                    sVar91 = auVar63._6_2_;
                    in_XMM15[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[6] - (0xff < sVar91);
                    sVar91 = auVar63._8_2_;
                    in_XMM15[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[8] - (0xff < sVar91);
                    sVar91 = auVar63._10_2_;
                    in_XMM15[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[10] - (0xff < sVar91);
                    sVar91 = auVar63._12_2_;
                    in_XMM15[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[0xc] - (0xff < sVar91);
                    sVar91 = auVar63._14_2_;
                    in_XMM15[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar63[0xe] - (0xff < sVar91);
                    sVar91 = in_XMM10._0_2_;
                    in_XMM15[8] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[0] - (0xff < sVar91);
                    sVar91 = in_XMM10._2_2_;
                    in_XMM15[9] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[2] - (0xff < sVar91);
                    sVar91 = in_XMM10._4_2_;
                    in_XMM15[10] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[4] - (0xff < sVar91);
                    sVar91 = in_XMM10._6_2_;
                    in_XMM15[0xb] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[6] - (0xff < sVar91);
                    sVar91 = in_XMM10._8_2_;
                    in_XMM15[0xc] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[8] - (0xff < sVar91);
                    sVar91 = in_XMM10._10_2_;
                    in_XMM15[0xd] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[10] - (0xff < sVar91)
                    ;
                    sVar91 = in_XMM10._12_2_;
                    in_XMM15[0xe] =
                         (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[0xc] - (0xff < sVar91);
                    sVar91 = in_XMM10._14_2_;
                    in_XMM15[0xf] =
                         (0 < sVar91) * (sVar91 < 0x100) * in_XMM10[0xe] - (0xff < sVar91);
                    auVar51._0_2_ = auVar95._0_2_ * sVar93 + sVar121;
                    auVar51._2_2_ = auVar95._2_2_ * sVar102 + sVar130;
                    auVar51._4_2_ = auVar95._4_2_ * sVar104 + sVar131;
                    auVar51._6_2_ = auVar95._6_2_ * sVar106 + sVar134;
                    auVar51._8_2_ = auVar95._8_2_ * sVar108 + sVar135;
                    auVar51._10_2_ = auVar95._10_2_ * sVar110 + sVar137;
                    auVar51._12_2_ = auVar95._12_2_ * sVar112 + sVar138;
                    auVar51._14_2_ = auVar95._14_2_ * sVar114 + sVar141;
                    auVar63 = pmulhuw(auVar51,auVar15);
                    sVar93 = auVar63._0_2_;
                    sVar102 = auVar63._2_2_;
                    in_XMM2[1] = (0 < sVar102) * (sVar102 < 0x100) * auVar63[2] - (0xff < sVar102);
                    in_XMM2[0] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[0] - (0xff < sVar93);
                    sVar93 = auVar63._4_2_;
                    in_XMM2[2] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[4] - (0xff < sVar93);
                    sVar93 = auVar63._6_2_;
                    in_XMM2[3] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[6] - (0xff < sVar93);
                    sVar93 = auVar63._8_2_;
                    in_XMM2[4] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[8] - (0xff < sVar93);
                    sVar93 = auVar63._10_2_;
                    in_XMM2[5] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[10] - (0xff < sVar93);
                    sVar93 = auVar63._12_2_;
                    in_XMM2[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[0xc] - (0xff < sVar93);
                    sVar93 = auVar63._14_2_;
                    in_XMM2[7] = (0 < sVar93) * (sVar93 < 0x100) * auVar63[0xe] - (0xff < sVar93);
                    sVar93 = auVar76._0_2_;
                    in_XMM2[8] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0] - (0xff < sVar93);
                    sVar93 = auVar76._2_2_;
                    in_XMM2[9] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[2] - (0xff < sVar93);
                    sVar93 = auVar76._4_2_;
                    in_XMM2[10] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[4] - (0xff < sVar93);
                    sVar93 = auVar76._6_2_;
                    in_XMM2[0xb] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[6] - (0xff < sVar93);
                    sVar93 = auVar76._8_2_;
                    in_XMM2[0xc] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[8] - (0xff < sVar93);
                    sVar93 = auVar76._10_2_;
                    in_XMM2[0xd] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[10] - (0xff < sVar93);
                    sVar93 = auVar76._12_2_;
                    in_XMM2[0xe] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xc] - (0xff < sVar93);
                    sVar93 = auVar76._14_2_;
                    in_XMM2[0xf] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xe] - (0xff < sVar93);
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM15;
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = in_XMM2;
                    uVar21 = uVar21 + 8;
                    uVar18 = uVar18 - 2;
                  }
                  if (uVar18 != 0) {
                    auVar63 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                    auVar76 = pmovzxbw(in_XMM10,auVar63);
                    auVar58._0_2_ = (ushort)auVar63[8] * sVar93 + sVar121;
                    auVar58._2_2_ = (ushort)auVar63[9] * sVar102 + sVar130;
                    auVar58._4_2_ = (ushort)auVar63[10] * sVar104 + sVar131;
                    auVar58._6_2_ = (ushort)auVar63[0xb] * sVar106 + sVar134;
                    auVar58._8_2_ = (ushort)auVar63[0xc] * sVar108 + sVar135;
                    auVar58._10_2_ = (ushort)auVar63[0xd] * sVar110 + sVar137;
                    auVar58._12_2_ = (ushort)auVar63[0xe] * sVar112 + sVar138;
                    auVar58._14_2_ = (ushort)auVar63[0xf] * sVar114 + sVar141;
                    in_XMM2 = pmulhuw(auVar58,auVar15);
                    auVar89._0_2_ = auVar76._0_2_ * sVar93 + sVar121;
                    auVar89._2_2_ = auVar76._2_2_ * sVar102 + sVar130;
                    auVar89._4_2_ = auVar76._4_2_ * sVar104 + sVar131;
                    auVar89._6_2_ = auVar76._6_2_ * sVar106 + sVar134;
                    auVar89._8_2_ = auVar76._8_2_ * sVar108 + sVar135;
                    auVar89._10_2_ = auVar76._10_2_ * sVar110 + sVar137;
                    auVar89._12_2_ = auVar76._12_2_ * sVar112 + sVar138;
                    auVar89._14_2_ = auVar76._14_2_ * sVar114 + sVar141;
                    auVar63 = pmulhuw(auVar89,auVar15);
                    sVar121 = auVar63._0_2_;
                    sVar130 = auVar63._2_2_;
                    in_XMM10[1] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[2] - (0xff < sVar130);
                    in_XMM10[0] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] - (0xff < sVar121);
                    sVar121 = auVar63._4_2_;
                    in_XMM10[2] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[4] - (0xff < sVar121);
                    sVar121 = auVar63._6_2_;
                    in_XMM10[3] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[6] - (0xff < sVar121);
                    sVar121 = auVar63._8_2_;
                    in_XMM10[4] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[8] - (0xff < sVar121);
                    sVar121 = auVar63._10_2_;
                    in_XMM10[5] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[10] - (0xff < sVar121)
                    ;
                    sVar121 = auVar63._12_2_;
                    in_XMM10[6] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0xc] -
                                  (0xff < sVar121);
                    sVar121 = auVar63._14_2_;
                    in_XMM10[7] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0xe] -
                                  (0xff < sVar121);
                    sVar121 = in_XMM2._0_2_;
                    in_XMM10[8] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0] - (0xff < sVar121);
                    sVar121 = in_XMM2._2_2_;
                    in_XMM10[9] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[2] - (0xff < sVar121);
                    sVar121 = in_XMM2._4_2_;
                    in_XMM10[10] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[4] - (0xff < sVar121)
                    ;
                    sVar121 = in_XMM2._6_2_;
                    in_XMM10[0xb] =
                         (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[6] - (0xff < sVar121);
                    sVar121 = in_XMM2._8_2_;
                    in_XMM10[0xc] =
                         (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[8] - (0xff < sVar121);
                    sVar121 = in_XMM2._10_2_;
                    in_XMM10[0xd] =
                         (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[10] - (0xff < sVar121);
                    sVar121 = in_XMM2._12_2_;
                    in_XMM10[0xe] =
                         (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0xc] - (0xff < sVar121);
                    sVar121 = in_XMM2._14_2_;
                    in_XMM10[0xf] =
                         (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0xe] - (0xff < sVar121);
                    *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM10;
                    uVar21 = uVar21 + 4;
                  }
                  for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
                    auVar63 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar21 * 4)),
                                       ZEXT416(*(uint *)(puVar35 + uVar21 * 4)));
                    auVar59._0_2_ = auVar63._0_2_ * sVar93 + sVar116 * sVar37 + sVar94;
                    auVar59._2_2_ = auVar63._2_2_ * sVar102 + sVar60 * sVar40 + sVar103;
                    auVar59._4_2_ = auVar63._4_2_ * sVar104 + sVar116 * sVar41 + sVar105;
                    auVar59._6_2_ = auVar63._6_2_ * sVar106 + sVar60 * sVar42 + sVar107;
                    auVar59._8_2_ = auVar63._8_2_ * sVar108 + sVar116 * sVar43 + sVar109;
                    auVar59._10_2_ = auVar63._10_2_ * sVar110 + sVar60 * sVar44 + sVar111;
                    auVar59._12_2_ = auVar63._12_2_ * sVar112 + sVar116 * sVar45 + sVar113;
                    auVar59._14_2_ = auVar63._14_2_ * sVar114 + sVar60 * sVar46 + sVar115;
                    auVar63 = pmulhuw(auVar59,auVar16);
                    sVar121 = auVar63._0_2_;
                    sVar130 = auVar63._2_2_;
                    sVar131 = auVar63._4_2_;
                    sVar134 = auVar63._6_2_;
                    in_XMM2._0_4_ =
                         CONCAT13((0 < sVar134) * (sVar134 < 0x100) * auVar63[6] - (0xff < sVar134),
                                  CONCAT12((0 < sVar131) * (sVar131 < 0x100) * auVar63[4] -
                                           (0xff < sVar131),
                                           CONCAT11((0 < sVar130) * (sVar130 < 0x100) * auVar63[2] -
                                                    (0xff < sVar130),
                                                    (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] -
                                                    (0xff < sVar121))));
                    sVar135 = auVar63._8_2_;
                    in_XMM2[4] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[8] - (0xff < sVar135);
                    sVar137 = auVar63._10_2_;
                    in_XMM2[5] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[10] - (0xff < sVar137);
                    sVar138 = auVar63._12_2_;
                    in_XMM2[6] = (0 < sVar138) * (sVar138 < 0x100) * auVar63[0xc] - (0xff < sVar138)
                    ;
                    sVar141 = auVar63._14_2_;
                    in_XMM2[7] = (0 < sVar141) * (sVar141 < 0x100) * auVar63[0xe] - (0xff < sVar141)
                    ;
                    in_XMM2[8] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] - (0xff < sVar121);
                    in_XMM2[9] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[2] - (0xff < sVar130);
                    in_XMM2[10] = (0 < sVar131) * (sVar131 < 0x100) * auVar63[4] - (0xff < sVar131);
                    in_XMM2[0xb] = (0 < sVar134) * (sVar134 < 0x100) * auVar63[6] - (0xff < sVar134)
                    ;
                    in_XMM2[0xc] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[8] - (0xff < sVar135)
                    ;
                    in_XMM2[0xd] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[10] -
                                   (0xff < sVar137);
                    in_XMM2[0xe] = (0 < sVar138) * (sVar138 < 0x100) * auVar63[0xc] -
                                   (0xff < sVar138);
                    in_XMM2[0xf] = (0 < sVar141) * (sVar141 < 0x100) * auVar63[0xe] -
                                   (0xff < sVar141);
                    *(undefined4 *)(puVar35 + uVar21 * 4) = in_XMM2._0_4_;
                  }
                }
              }
            }
            if (BVar27 == uVar32) {
              uVar21 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
              if (uVar30 < uVar21) {
                uVar21 = uVar30;
              }
              BVar27 = 0;
            }
            else {
              uVar32 = uVar32 ^ BVar27;
              lVar25 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              BVar27 = -1L << ((byte)lVar25 & 0x3f) ^ uVar32;
              uVar21 = (uint)((int)lVar25 << 3) | uVar20;
            }
            auVar100 = ZEXT416(uVar139);
            if (3 < uVar21 - uVar24) {
              uVar23 = uVar21 - uVar24 >> 2;
              auVar100._4_4_ = uVar139;
              auVar100._0_4_ = uVar139;
              auVar100._8_4_ = uVar139;
              auVar100._12_4_ = uVar139;
              while (bVar36 = uVar23 != 0, uVar23 = uVar23 - 1, bVar36) {
                pCVar1 = pCVar34 + uVar24;
                iVar47 = pCVar1->cover;
                pCVar3 = pCVar34 + uVar24 + 2;
                iVar136 = iVar47 + pCVar1[1].cover;
                auVar13._4_4_ = iVar136;
                auVar13._0_4_ = iVar47;
                auVar13._8_8_ = 0;
                iVar122 = auVar100._0_4_;
                iVar132 = auVar100._4_4_;
                iVar133 = auVar100._8_4_;
                iVar140 = pCVar3->cover + pCVar3[1].cover + auVar100._12_4_ + iVar136;
                auVar100._4_4_ = iVar140;
                auVar100._0_4_ = iVar140;
                auVar100._8_4_ = iVar140;
                auVar100._12_4_ = iVar140;
                auVar129._0_4_ = (iVar47 + iVar122) - ((uint)pCVar1->area >> 9);
                auVar129._4_4_ = (iVar136 + iVar132) - ((uint)pCVar1[1].area >> 9);
                auVar129._8_4_ =
                     (pCVar1[1].cover + pCVar3->cover + iVar133 + iVar47) -
                     ((uint)pCVar3->area >> 9);
                auVar129._12_4_ = iVar140 - ((uint)pCVar3[1].area >> 9);
                auVar76 = packusdw(auVar129 & auVar61,auVar129 & auVar61);
                iVar47 = 0x1ff01ff - auVar76._0_4_;
                iVar122 = 0x1ff01ff - auVar76._4_4_;
                iVar132 = 0x1ff01ff - auVar76._8_4_;
                iVar133 = 0x1ff01ff - auVar76._12_4_;
                sVar116 = auVar76._0_2_;
                sVar130 = (short)iVar47;
                sVar60 = auVar76._2_2_;
                sVar131 = (short)((uint)iVar47 >> 0x10);
                sVar121 = auVar76._4_2_;
                sVar134 = (short)iVar122;
                uVar90 = (ushort)(sVar121 < sVar134) * sVar121 |
                         (ushort)(sVar121 >= sVar134) * sVar134;
                sVar121 = auVar76._6_2_;
                sVar134 = (short)((uint)iVar122 >> 0x10);
                uVar92 = (ushort)(sVar121 < sVar134) * sVar121 |
                         (ushort)(sVar121 >= sVar134) * sVar134;
                auVar53._0_8_ =
                     CONCAT26(uVar92,CONCAT24(uVar90,CONCAT22((ushort)(sVar60 < sVar131) * sVar60 |
                                                              (ushort)(sVar60 >= sVar131) * sVar131,
                                                              (ushort)(sVar116 < sVar130) * sVar116
                                                              | (ushort)(sVar116 >= sVar130) *
                                                                sVar130)));
                sVar116 = auVar76._8_2_;
                sVar60 = (short)iVar132;
                auVar49._0_10_ =
                     CONCAT28((ushort)(sVar116 < sVar60) * sVar116 |
                              (ushort)(sVar116 >= sVar60) * sVar60,auVar53._0_8_);
                sVar116 = auVar76._10_2_;
                sVar60 = (short)((uint)iVar132 >> 0x10);
                auVar49._10_2_ =
                     (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
                sVar116 = auVar76._12_2_;
                sVar60 = (short)iVar133;
                sVar121 = (short)((uint)iVar133 >> 0x10);
                auVar52._12_2_ =
                     (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
                auVar52._0_12_ = auVar49;
                sVar116 = auVar76._14_2_;
                auVar52._14_2_ =
                     (ushort)(sVar116 < sVar121) * sVar116 | (ushort)(sVar116 >= sVar121) * sVar121;
                auVar95 = pshuflw(auVar13 << 0x40,auVar52,0x50);
                auVar55._12_2_ = uVar92;
                auVar55._0_12_ = auVar49;
                auVar55._14_2_ = uVar92;
                auVar54._12_4_ = auVar55._12_4_;
                auVar54._10_2_ = uVar90;
                auVar54._0_10_ = auVar49._0_10_;
                auVar53._10_6_ = auVar54._10_6_;
                auVar53._8_2_ = uVar90;
                *(undefined1 (*) [16])(pCVar34 + uVar24) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pCVar34 + uVar24 + 2) = (undefined1  [16])0x0;
                auVar63 = *(undefined1 (*) [16])(puVar35 + uVar24 * 4);
                auVar123 = pmovzxbw(auVar76,auVar63);
                auVar86._0_4_ = auVar95._0_4_;
                auVar86._4_4_ = auVar86._0_4_;
                auVar86._8_4_ = auVar95._4_4_;
                auVar86._12_4_ = auVar95._4_4_;
                auVar56._4_4_ = auVar53._8_4_;
                auVar56._0_4_ = auVar53._8_4_;
                auVar56._8_4_ = auVar54._12_4_;
                auVar56._12_4_ = auVar54._12_4_;
                auVar76 = pmovzxbw(in_XMM3,0xffffffffffffffff);
                auVar86 = auVar86 ^ auVar76;
                in_XMM10._0_2_ = auVar86._0_2_ * auVar123._0_2_;
                in_XMM10._2_2_ = auVar86._2_2_ * auVar123._2_2_;
                in_XMM10._4_2_ = auVar86._4_2_ * auVar123._4_2_;
                in_XMM10._6_2_ = auVar86._6_2_ * auVar123._6_2_;
                in_XMM10._8_2_ = auVar86._8_2_ * auVar123._8_2_;
                in_XMM10._10_2_ = auVar86._10_2_ * auVar123._10_2_;
                in_XMM10._12_2_ = auVar86._12_2_ * auVar123._12_2_;
                in_XMM10._14_2_ = auVar86._14_2_ * auVar123._14_2_;
                auVar56 = auVar56 ^ auVar76;
                in_XMM2._0_2_ = auVar56._0_2_ * (ushort)auVar63[8];
                in_XMM2._2_2_ = auVar56._2_2_ * (ushort)auVar63[9];
                in_XMM2._4_2_ = auVar56._4_2_ * (ushort)auVar63[10];
                in_XMM2._6_2_ = auVar56._6_2_ * (ushort)auVar63[0xb];
                in_XMM2._8_2_ = auVar56._8_2_ * (ushort)auVar63[0xc];
                in_XMM2._10_2_ = auVar56._10_2_ * (ushort)auVar63[0xd];
                in_XMM2._12_2_ = auVar56._12_2_ * (ushort)auVar63[0xe];
                in_XMM2._14_2_ = auVar56._14_2_ * (ushort)auVar63[0xf];
                in_XMM3 = pmovzxbw(auVar76,0x8080808080808080);
                auVar147._0_2_ = auVar95._0_2_ * sVar37 + in_XMM3._0_2_ + in_XMM10._0_2_;
                auVar147._2_2_ = auVar95._2_2_ * sVar40 + in_XMM3._2_2_ + in_XMM10._2_2_;
                auVar147._4_2_ = auVar95._0_2_ * sVar41 + in_XMM3._4_2_ + in_XMM10._4_2_;
                auVar147._6_2_ = auVar95._2_2_ * sVar42 + in_XMM3._6_2_ + in_XMM10._6_2_;
                auVar147._8_2_ = auVar95._4_2_ * sVar43 + in_XMM3._8_2_ + in_XMM10._8_2_;
                auVar147._10_2_ = auVar95._6_2_ * sVar44 + in_XMM3._10_2_ + in_XMM10._10_2_;
                auVar147._12_2_ = auVar95._4_2_ * sVar45 + in_XMM3._12_2_ + in_XMM10._12_2_;
                auVar147._14_2_ = auVar95._6_2_ * sVar46 + in_XMM3._14_2_ + in_XMM10._14_2_;
                auVar63 = pmulhuw(auVar147,auVar15);
                auVar154._0_2_ = uVar90 * sVar37 + in_XMM3._0_2_ + in_XMM2._0_2_;
                auVar154._2_2_ = uVar90 * sVar40 + in_XMM3._2_2_ + in_XMM2._2_2_;
                auVar154._4_2_ = uVar90 * sVar41 + in_XMM3._4_2_ + in_XMM2._4_2_;
                auVar154._6_2_ = uVar90 * sVar42 + in_XMM3._6_2_ + in_XMM2._6_2_;
                auVar154._8_2_ = uVar92 * sVar43 + in_XMM3._8_2_ + in_XMM2._8_2_;
                auVar154._10_2_ = uVar92 * sVar44 + in_XMM3._10_2_ + in_XMM2._10_2_;
                auVar154._12_2_ = uVar92 * sVar45 + in_XMM3._12_2_ + in_XMM2._12_2_;
                auVar154._14_2_ = uVar92 * sVar46 + in_XMM3._14_2_ + in_XMM2._14_2_;
                in_XMM15 = pmulhuw(auVar154,auVar15);
                sVar116 = auVar63._0_2_;
                sVar60 = auVar63._2_2_;
                sVar121 = auVar63._4_2_;
                sVar130 = auVar63._6_2_;
                sVar131 = auVar63._8_2_;
                sVar134 = auVar63._10_2_;
                sVar135 = auVar63._12_2_;
                sVar137 = auVar63._14_2_;
                sVar138 = in_XMM15._0_2_;
                sVar141 = in_XMM15._2_2_;
                sVar93 = in_XMM15._4_2_;
                sVar102 = in_XMM15._6_2_;
                sVar104 = in_XMM15._8_2_;
                sVar106 = in_XMM15._10_2_;
                sVar108 = in_XMM15._12_2_;
                sVar110 = in_XMM15._14_2_;
                puVar2 = puVar35 + uVar24 * 4;
                *puVar2 = (0 < sVar116) * (sVar116 < 0x100) * auVar63[0] - (0xff < sVar116);
                puVar2[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar63[2] - (0xff < sVar60);
                puVar2[2] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[4] - (0xff < sVar121);
                puVar2[3] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[6] - (0xff < sVar130);
                puVar2[4] = (0 < sVar131) * (sVar131 < 0x100) * auVar63[8] - (0xff < sVar131);
                puVar2[5] = (0 < sVar134) * (sVar134 < 0x100) * auVar63[10] - (0xff < sVar134);
                puVar2[6] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[0xc] - (0xff < sVar135);
                puVar2[7] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[0xe] - (0xff < sVar137);
                puVar2[8] = (0 < sVar138) * (sVar138 < 0x100) * in_XMM15[0] - (0xff < sVar138);
                puVar2[9] = (0 < sVar141) * (sVar141 < 0x100) * in_XMM15[2] - (0xff < sVar141);
                puVar2[10] = (0 < sVar93) * (sVar93 < 0x100) * in_XMM15[4] - (0xff < sVar93);
                puVar2[0xb] = (0 < sVar102) * (sVar102 < 0x100) * in_XMM15[6] - (0xff < sVar102);
                puVar2[0xc] = (0 < sVar104) * (sVar104 < 0x100) * in_XMM15[8] - (0xff < sVar104);
                puVar2[0xd] = (0 < sVar106) * (sVar106 < 0x100) * in_XMM15[10] - (0xff < sVar106);
                puVar2[0xe] = (0 < sVar108) * (sVar108 < 0x100) * in_XMM15[0xc] - (0xff < sVar108);
                puVar2[0xf] = (0 < sVar110) * (sVar110 < 0x100) * in_XMM15[0xe] - (0xff < sVar110);
                uVar24 = uVar24 + 4;
              }
            }
            for (; uVar139 = auVar100._0_4_, uVar24 < uVar21; uVar24 = uVar24 + 1) {
              uVar28 = pCVar34[uVar24].area;
              auVar101._0_4_ = uVar139 + pCVar34[uVar24].cover;
              auVar101._4_4_ = auVar100._4_4_;
              auVar101._8_4_ = auVar100._8_4_;
              auVar101._12_4_ = auVar100._12_4_;
              pCVar34[uVar24].cover = 0;
              pCVar34[uVar24].area = 0;
              auVar57._0_4_ = auVar101._0_4_ - (uVar28 >> 9);
              auVar57._4_4_ = auVar101._4_4_;
              auVar57._8_4_ = auVar101._8_4_;
              auVar57._12_4_ = auVar101._12_4_;
              auVar63 = packusdw(auVar57 & auVar61,auVar57 & auVar61);
              iVar47 = auVar61._0_4_ - auVar63._0_4_;
              iVar122 = auVar61._4_4_ - auVar63._4_4_;
              iVar132 = auVar61._8_4_ - auVar63._8_4_;
              iVar133 = auVar61._12_4_ - auVar63._12_4_;
              sVar116 = auVar63._0_2_;
              sVar60 = (short)iVar47;
              auVar87._0_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._2_2_;
              sVar60 = (short)((uint)iVar47 >> 0x10);
              auVar87._2_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._4_2_;
              sVar60 = (short)iVar122;
              auVar87._4_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._6_2_;
              sVar60 = (short)((uint)iVar122 >> 0x10);
              auVar87._6_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._8_2_;
              sVar60 = (short)iVar132;
              auVar87._8_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._10_2_;
              sVar60 = (short)((uint)iVar132 >> 0x10);
              auVar87._10_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._12_2_;
              sVar60 = (short)iVar133;
              sVar121 = (short)((uint)iVar133 >> 0x10);
              auVar87._12_2_ =
                   (ushort)(sVar116 < sVar60) * sVar116 | (ushort)(sVar116 >= sVar60) * sVar60;
              sVar116 = auVar63._14_2_;
              auVar87._14_2_ =
                   (ushort)(sVar116 < sVar121) * sVar116 | (ushort)(sVar116 >= sVar121) * sVar121;
              auVar63 = pshuflw(auVar87,auVar87,0);
              in_XMM2 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar24 * 4)),
                                 ZEXT416(*(uint *)(puVar35 + uVar24 * 4)));
              auVar76 = auVar63 ^ auVar62;
              auVar88._0_2_ = auVar76._0_2_ * in_XMM2._0_2_ + auVar63._0_2_ * sVar37 + sVar94;
              auVar88._2_2_ = auVar76._2_2_ * in_XMM2._2_2_ + auVar63._2_2_ * sVar40 + sVar103;
              auVar88._4_2_ = auVar76._4_2_ * in_XMM2._4_2_ + auVar63._4_2_ * sVar41 + sVar105;
              auVar88._6_2_ = auVar76._6_2_ * in_XMM2._6_2_ + auVar63._6_2_ * sVar42 + sVar107;
              auVar88._8_2_ = auVar76._8_2_ * in_XMM2._8_2_ + auVar63._8_2_ * sVar43 + sVar109;
              auVar88._10_2_ = auVar76._10_2_ * in_XMM2._10_2_ + auVar63._10_2_ * sVar44 + sVar111;
              auVar88._12_2_ = auVar76._12_2_ * in_XMM2._12_2_ + auVar63._12_2_ * sVar45 + sVar113;
              auVar88._14_2_ = auVar76._14_2_ * in_XMM2._14_2_ + auVar63._14_2_ * sVar46 + sVar115;
              auVar63 = pmulhuw(auVar88,auVar16);
              sVar116 = auVar63._0_2_;
              sVar60 = auVar63._2_2_;
              sVar121 = auVar63._4_2_;
              sVar130 = auVar63._6_2_;
              in_XMM10._0_4_ =
                   CONCAT13((0 < sVar130) * (sVar130 < 0x100) * auVar63[6] - (0xff < sVar130),
                            CONCAT12((0 < sVar121) * (sVar121 < 0x100) * auVar63[4] -
                                     (0xff < sVar121),
                                     CONCAT11((0 < sVar60) * (sVar60 < 0x100) * auVar63[2] -
                                              (0xff < sVar60),
                                              (0 < sVar116) * (sVar116 < 0x100) * auVar63[0] -
                                              (0xff < sVar116))));
              sVar131 = auVar63._8_2_;
              in_XMM10[4] = (0 < sVar131) * (sVar131 < 0x100) * auVar63[8] - (0xff < sVar131);
              sVar134 = auVar63._10_2_;
              in_XMM10[5] = (0 < sVar134) * (sVar134 < 0x100) * auVar63[10] - (0xff < sVar134);
              sVar135 = auVar63._12_2_;
              in_XMM10[6] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[0xc] - (0xff < sVar135);
              sVar137 = auVar63._14_2_;
              in_XMM10[7] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[0xe] - (0xff < sVar137);
              in_XMM10[8] = (0 < sVar116) * (sVar116 < 0x100) * auVar63[0] - (0xff < sVar116);
              in_XMM10[9] = (0 < sVar60) * (sVar60 < 0x100) * auVar63[2] - (0xff < sVar60);
              in_XMM10[10] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[4] - (0xff < sVar121);
              in_XMM10[0xb] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[6] - (0xff < sVar130);
              in_XMM10[0xc] = (0 < sVar131) * (sVar131 < 0x100) * auVar63[8] - (0xff < sVar131);
              in_XMM10[0xd] = (0 < sVar134) * (sVar134 < 0x100) * auVar63[10] - (0xff < sVar134);
              in_XMM10[0xe] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[0xc] - (0xff < sVar135);
              in_XMM10[0xf] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[0xe] - (0xff < sVar137);
              *(undefined4 *)(puVar35 + uVar24 * 4) = in_XMM10._0_4_;
              auVar100 = auVar101;
            }
          }
          pBVar33 = pBVar33 + 1;
          sVar19 = sVar19 - 1;
          uVar20 = uVar30;
        } while (sVar19 != 0);
        uVar20 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
        uVar30 = uVar20 - uVar21;
        if (uVar21 <= uVar20 && uVar30 != 0) {
          uVar139 = uVar139 & 0x1ff;
          uVar28 = uVar139 ^ 0x1ff;
          if (uVar139 < 0x100) {
            uVar28 = uVar139;
          }
          if (uVar28 != 0) {
            uVar24 = uVar30 >> 2;
            if (uVar28 == 0xff) {
              puVar26 = (uint32_t *)(puVar35 + uVar21 * 4);
              for (uVar23 = uVar24; 7 < uVar23; uVar23 = uVar23 - 8) {
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x20) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x30) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x40) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x50) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x60) = auVar38;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x70) = auVar38;
                uVar21 = uVar21 + 0x20;
                puVar26 = puVar26 + 0x20;
              }
              lVar25 = uVar24 - (uVar30 >> 2 & 0x3ffffffffffffff8);
              while (bVar36 = lVar25 != 0, lVar25 = lVar25 + -1, bVar36) {
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar38;
                uVar21 = uVar21 + 4;
                puVar26 = puVar26 + 4;
              }
              for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
                *puVar26 = uVar17;
                puVar26 = puVar26 + 1;
              }
            }
            else {
              in_XMM2 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
              uVar48 = in_XMM2._0_4_;
              auVar63._4_4_ = uVar48;
              auVar63._0_4_ = uVar48;
              auVar63._8_4_ = uVar48;
              auVar63._12_4_ = uVar48;
              sVar116 = in_XMM2._0_2_;
              sVar60 = in_XMM2._2_2_;
              auVar63 = auVar63 ^ _DAT_00118170;
              sVar121 = sVar116 * sVar37 + 0x80;
              sVar130 = sVar60 * sVar40 + 0x80;
              sVar131 = sVar116 * sVar41 + 0x80;
              sVar134 = sVar60 * sVar42 + 0x80;
              sVar135 = sVar116 * sVar43 + 0x80;
              sVar137 = sVar60 * sVar44 + 0x80;
              sVar138 = sVar116 * sVar45 + 0x80;
              sVar141 = sVar60 * sVar46 + 0x80;
              uVar23 = uVar24;
              while( true ) {
                sVar93 = auVar63._0_2_;
                sVar102 = auVar63._2_2_;
                sVar104 = auVar63._4_2_;
                sVar106 = auVar63._6_2_;
                sVar108 = auVar63._8_2_;
                sVar110 = auVar63._10_2_;
                sVar112 = auVar63._12_2_;
                sVar114 = auVar63._14_2_;
                if (uVar23 < 2) break;
                auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                auVar95 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10);
                auVar149 = pmovzxbw(in_XMM15,auVar76);
                auVar123 = pmovzxbw(in_XMM10,auVar95);
                auVar143._0_2_ = (ushort)auVar76[8] * sVar93 + sVar121;
                auVar143._2_2_ = (ushort)auVar76[9] * sVar102 + sVar130;
                auVar143._4_2_ = (ushort)auVar76[10] * sVar104 + sVar131;
                auVar143._6_2_ = (ushort)auVar76[0xb] * sVar106 + sVar134;
                auVar143._8_2_ = (ushort)auVar76[0xc] * sVar108 + sVar135;
                auVar143._10_2_ = (ushort)auVar76[0xd] * sVar110 + sVar137;
                auVar143._12_2_ = (ushort)auVar76[0xe] * sVar112 + sVar138;
                auVar143._14_2_ = (ushort)auVar76[0xf] * sVar114 + sVar141;
                in_XMM2 = pmulhuw(auVar143,auVar15);
                auVar148._0_2_ = (ushort)auVar95[8] * sVar93 + sVar121;
                auVar148._2_2_ = (ushort)auVar95[9] * sVar102 + sVar130;
                auVar148._4_2_ = (ushort)auVar95[10] * sVar104 + sVar131;
                auVar148._6_2_ = (ushort)auVar95[0xb] * sVar106 + sVar134;
                auVar148._8_2_ = (ushort)auVar95[0xc] * sVar108 + sVar135;
                auVar148._10_2_ = (ushort)auVar95[0xd] * sVar110 + sVar137;
                auVar148._12_2_ = (ushort)auVar95[0xe] * sVar112 + sVar138;
                auVar148._14_2_ = (ushort)auVar95[0xf] * sVar114 + sVar141;
                auVar95 = pmulhuw(auVar148,auVar15);
                auVar155._0_2_ = auVar149._0_2_ * sVar93 + sVar121;
                auVar155._2_2_ = auVar149._2_2_ * sVar102 + sVar130;
                auVar155._4_2_ = auVar149._4_2_ * sVar104 + sVar131;
                auVar155._6_2_ = auVar149._6_2_ * sVar106 + sVar134;
                auVar155._8_2_ = auVar149._8_2_ * sVar108 + sVar135;
                auVar155._10_2_ = auVar149._10_2_ * sVar110 + sVar137;
                auVar155._12_2_ = auVar149._12_2_ * sVar112 + sVar138;
                auVar155._14_2_ = auVar149._14_2_ * sVar114 + sVar141;
                auVar76 = pmulhuw(auVar155,auVar15);
                sVar91 = auVar76._0_2_;
                sVar66 = auVar76._2_2_;
                in_XMM15[1] = (0 < sVar66) * (sVar66 < 0x100) * auVar76[2] - (0xff < sVar66);
                in_XMM15[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0] - (0xff < sVar91);
                sVar91 = auVar76._4_2_;
                in_XMM15[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[4] - (0xff < sVar91);
                sVar91 = auVar76._6_2_;
                in_XMM15[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[6] - (0xff < sVar91);
                sVar91 = auVar76._8_2_;
                in_XMM15[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[8] - (0xff < sVar91);
                sVar91 = auVar76._10_2_;
                in_XMM15[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[10] - (0xff < sVar91);
                sVar91 = auVar76._12_2_;
                in_XMM15[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0xc] - (0xff < sVar91);
                sVar91 = auVar76._14_2_;
                in_XMM15[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0xe] - (0xff < sVar91);
                sVar91 = in_XMM2._0_2_;
                in_XMM15[8] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[0] - (0xff < sVar91);
                sVar91 = in_XMM2._2_2_;
                in_XMM15[9] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[2] - (0xff < sVar91);
                sVar91 = in_XMM2._4_2_;
                in_XMM15[10] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[4] - (0xff < sVar91);
                sVar91 = in_XMM2._6_2_;
                in_XMM15[0xb] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[6] - (0xff < sVar91);
                sVar91 = in_XMM2._8_2_;
                in_XMM15[0xc] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[8] - (0xff < sVar91);
                sVar91 = in_XMM2._10_2_;
                in_XMM15[0xd] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[10] - (0xff < sVar91);
                sVar91 = in_XMM2._12_2_;
                in_XMM15[0xe] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[0xc] - (0xff < sVar91);
                sVar91 = in_XMM2._14_2_;
                in_XMM15[0xf] = (0 < sVar91) * (sVar91 < 0x100) * in_XMM2[0xe] - (0xff < sVar91);
                auVar149._0_2_ = auVar123._0_2_ * sVar93 + sVar121;
                auVar149._2_2_ = auVar123._2_2_ * sVar102 + sVar130;
                auVar149._4_2_ = auVar123._4_2_ * sVar104 + sVar131;
                auVar149._6_2_ = auVar123._6_2_ * sVar106 + sVar134;
                auVar149._8_2_ = auVar123._8_2_ * sVar108 + sVar135;
                auVar149._10_2_ = auVar123._10_2_ * sVar110 + sVar137;
                auVar149._12_2_ = auVar123._12_2_ * sVar112 + sVar138;
                auVar149._14_2_ = auVar123._14_2_ * sVar114 + sVar141;
                auVar76 = pmulhuw(auVar149,auVar15);
                sVar93 = auVar76._0_2_;
                sVar102 = auVar76._2_2_;
                in_XMM10[1] = (0 < sVar102) * (sVar102 < 0x100) * auVar76[2] - (0xff < sVar102);
                in_XMM10[0] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0] - (0xff < sVar93);
                sVar93 = auVar76._4_2_;
                in_XMM10[2] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[4] - (0xff < sVar93);
                sVar93 = auVar76._6_2_;
                in_XMM10[3] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[6] - (0xff < sVar93);
                sVar93 = auVar76._8_2_;
                in_XMM10[4] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[8] - (0xff < sVar93);
                sVar93 = auVar76._10_2_;
                in_XMM10[5] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[10] - (0xff < sVar93);
                sVar93 = auVar76._12_2_;
                in_XMM10[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xc] - (0xff < sVar93);
                sVar93 = auVar76._14_2_;
                in_XMM10[7] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xe] - (0xff < sVar93);
                sVar93 = auVar95._0_2_;
                in_XMM10[8] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0] - (0xff < sVar93);
                sVar93 = auVar95._2_2_;
                in_XMM10[9] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[2] - (0xff < sVar93);
                sVar93 = auVar95._4_2_;
                in_XMM10[10] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[4] - (0xff < sVar93);
                sVar93 = auVar95._6_2_;
                in_XMM10[0xb] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[6] - (0xff < sVar93);
                sVar93 = auVar95._8_2_;
                in_XMM10[0xc] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[8] - (0xff < sVar93);
                sVar93 = auVar95._10_2_;
                in_XMM10[0xd] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[10] - (0xff < sVar93);
                sVar93 = auVar95._12_2_;
                in_XMM10[0xe] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xc] - (0xff < sVar93);
                sVar93 = auVar95._14_2_;
                in_XMM10[0xf] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xe] - (0xff < sVar93);
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM15;
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = in_XMM10;
                uVar21 = uVar21 + 8;
                uVar23 = uVar23 - 2;
              }
              if (uVar24 != (uVar30 >> 2 & 0x3ffffffffffffffe)) {
                auVar63 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                auVar95 = pmovzxbw(in_XMM10,auVar63);
                auVar76._0_2_ = (ushort)auVar63[8] * sVar93 + sVar121;
                auVar76._2_2_ = (ushort)auVar63[9] * sVar102 + sVar130;
                auVar76._4_2_ = (ushort)auVar63[10] * sVar104 + sVar131;
                auVar76._6_2_ = (ushort)auVar63[0xb] * sVar106 + sVar134;
                auVar76._8_2_ = (ushort)auVar63[0xc] * sVar108 + sVar135;
                auVar76._10_2_ = (ushort)auVar63[0xd] * sVar110 + sVar137;
                auVar76._12_2_ = (ushort)auVar63[0xe] * sVar112 + sVar138;
                auVar76._14_2_ = (ushort)auVar63[0xf] * sVar114 + sVar141;
                in_XMM2 = pmulhuw(auVar76,auVar15);
                auVar123._0_2_ = auVar95._0_2_ * sVar93 + sVar121;
                auVar123._2_2_ = auVar95._2_2_ * sVar102 + sVar130;
                auVar123._4_2_ = auVar95._4_2_ * sVar104 + sVar131;
                auVar123._6_2_ = auVar95._6_2_ * sVar106 + sVar134;
                auVar123._8_2_ = auVar95._8_2_ * sVar108 + sVar135;
                auVar123._10_2_ = auVar95._10_2_ * sVar110 + sVar137;
                auVar123._12_2_ = auVar95._12_2_ * sVar112 + sVar138;
                auVar123._14_2_ = auVar95._14_2_ * sVar114 + sVar141;
                auVar63 = pmulhuw(auVar123,auVar15);
                sVar121 = auVar63._0_2_;
                sVar130 = auVar63._2_2_;
                in_XMM10[1] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[2] - (0xff < sVar130);
                in_XMM10[0] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] - (0xff < sVar121);
                sVar121 = auVar63._4_2_;
                in_XMM10[2] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[4] - (0xff < sVar121);
                sVar121 = auVar63._6_2_;
                in_XMM10[3] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[6] - (0xff < sVar121);
                sVar121 = auVar63._8_2_;
                in_XMM10[4] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[8] - (0xff < sVar121);
                sVar121 = auVar63._10_2_;
                in_XMM10[5] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[10] - (0xff < sVar121);
                sVar121 = auVar63._12_2_;
                in_XMM10[6] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0xc] - (0xff < sVar121);
                sVar121 = auVar63._14_2_;
                in_XMM10[7] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0xe] - (0xff < sVar121);
                sVar121 = in_XMM2._0_2_;
                in_XMM10[8] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0] - (0xff < sVar121);
                sVar121 = in_XMM2._2_2_;
                in_XMM10[9] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[2] - (0xff < sVar121);
                sVar121 = in_XMM2._4_2_;
                in_XMM10[10] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[4] - (0xff < sVar121);
                sVar121 = in_XMM2._6_2_;
                in_XMM10[0xb] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[6] - (0xff < sVar121);
                sVar121 = in_XMM2._8_2_;
                in_XMM10[0xc] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[8] - (0xff < sVar121);
                sVar121 = in_XMM2._10_2_;
                in_XMM10[0xd] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[10] - (0xff < sVar121);
                sVar121 = in_XMM2._12_2_;
                in_XMM10[0xe] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0xc] - (0xff < sVar121);
                sVar121 = in_XMM2._14_2_;
                in_XMM10[0xf] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM2[0xe] - (0xff < sVar121);
                *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM10;
                uVar21 = uVar21 + 4;
              }
              for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
                auVar63 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar21 * 4)),
                                   ZEXT416(*(uint *)(puVar35 + uVar21 * 4)));
                auVar95._0_2_ = auVar63._0_2_ * sVar93 + sVar116 * sVar37 + sVar94;
                auVar95._2_2_ = auVar63._2_2_ * sVar102 + sVar60 * sVar40 + sVar103;
                auVar95._4_2_ = auVar63._4_2_ * sVar104 + sVar116 * sVar41 + sVar105;
                auVar95._6_2_ = auVar63._6_2_ * sVar106 + sVar60 * sVar42 + sVar107;
                auVar95._8_2_ = auVar63._8_2_ * sVar108 + sVar116 * sVar43 + sVar109;
                auVar95._10_2_ = auVar63._10_2_ * sVar110 + sVar60 * sVar44 + sVar111;
                auVar95._12_2_ = auVar63._12_2_ * sVar112 + sVar116 * sVar45 + sVar113;
                auVar95._14_2_ = auVar63._14_2_ * sVar114 + sVar60 * sVar46 + sVar115;
                auVar63 = pmulhuw(auVar95,auVar16);
                sVar121 = auVar63._0_2_;
                sVar130 = auVar63._2_2_;
                sVar131 = auVar63._4_2_;
                sVar134 = auVar63._6_2_;
                in_XMM2._0_4_ =
                     CONCAT13((0 < sVar134) * (sVar134 < 0x100) * auVar63[6] - (0xff < sVar134),
                              CONCAT12((0 < sVar131) * (sVar131 < 0x100) * auVar63[4] -
                                       (0xff < sVar131),
                                       CONCAT11((0 < sVar130) * (sVar130 < 0x100) * auVar63[2] -
                                                (0xff < sVar130),
                                                (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] -
                                                (0xff < sVar121))));
                sVar135 = auVar63._8_2_;
                in_XMM2[4] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[8] - (0xff < sVar135);
                sVar137 = auVar63._10_2_;
                in_XMM2[5] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[10] - (0xff < sVar137);
                sVar138 = auVar63._12_2_;
                in_XMM2[6] = (0 < sVar138) * (sVar138 < 0x100) * auVar63[0xc] - (0xff < sVar138);
                sVar141 = auVar63._14_2_;
                in_XMM2[7] = (0 < sVar141) * (sVar141 < 0x100) * auVar63[0xe] - (0xff < sVar141);
                in_XMM2[8] = (0 < sVar121) * (sVar121 < 0x100) * auVar63[0] - (0xff < sVar121);
                in_XMM2[9] = (0 < sVar130) * (sVar130 < 0x100) * auVar63[2] - (0xff < sVar130);
                in_XMM2[10] = (0 < sVar131) * (sVar131 < 0x100) * auVar63[4] - (0xff < sVar131);
                in_XMM2[0xb] = (0 < sVar134) * (sVar134 < 0x100) * auVar63[6] - (0xff < sVar134);
                in_XMM2[0xc] = (0 < sVar135) * (sVar135 < 0x100) * auVar63[8] - (0xff < sVar135);
                in_XMM2[0xd] = (0 < sVar137) * (sVar137 < 0x100) * auVar63[10] - (0xff < sVar137);
                in_XMM2[0xe] = (0 < sVar138) * (sVar138 < 0x100) * auVar63[0xc] - (0xff < sVar138);
                in_XMM2[0xf] = (0 < sVar141) * (sVar141 < 0x100) * auVar63[0xe] - (0xff < sVar141);
                *(undefined4 *)(puVar35 + uVar21 * 4) = in_XMM2._0_4_;
              }
            }
          }
        }
        puVar35 = puVar35 + lVar6;
        pCVar34 = pCVar34 + self->_cellStride;
      }
      (self->_yBounds).start = 0x7fffffff;
      (self->_yBounds).end = 0;
      return;
    }
    RasterizerA3<8u>::_renderImpl<CompositorScalar,false>((RasterizerA3<8u> *)self,argb32);
    return;
  }
  if ((uVar139 & 1) != 0) {
    pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
    lVar6 = pIVar5->_stride;
    uVar31 = (ulong)(self->_yBounds).start;
    iVar4 = (self->_yBounds).end;
    pBVar33 = self->_bits + self->_bitStride * uVar31;
    pCVar34 = self->_cells + self->_cellStride * uVar31;
    puVar35 = pIVar5->_data + lVar6 * uVar31;
    uVar17 = PixelUtils::premultiply(argb32);
    auVar16 = _DAT_001181c0;
    auVar15 = _DAT_00118190;
    auVar39._4_4_ = uVar17;
    auVar39._0_4_ = uVar17;
    auVar39._8_4_ = uVar17;
    auVar39._12_4_ = uVar17;
    auVar38 = pmovzxbw(in_XMM1,auVar39);
    auVar50 = pmovzxbw(in_XMM2,0xffffffffffffffff);
    auVar61 = pmovzxbw(in_XMM3,0x8080808080808080);
    auVar62 = pmovzxbw(in_XMM6,0x8080808080808080);
    auVar63 = pmovzxbw(in_XMM8,0xffffffffffffffff);
    for (; uVar31 <= (ulong)(long)iVar4; uVar31 = uVar31 + 1) {
      sVar19 = self->_bitStride;
      uVar139 = 0;
      uVar21 = 0;
      uVar20 = 0;
      do {
        BVar27 = *pBVar33;
        *pBVar33 = 0;
        uVar30 = uVar20 + 0x200;
        while( true ) {
          sVar37 = auVar38._0_2_;
          sVar40 = auVar38._2_2_;
          sVar41 = auVar38._4_2_;
          sVar42 = auVar38._6_2_;
          sVar43 = auVar38._8_2_;
          sVar44 = auVar38._10_2_;
          sVar45 = auVar38._12_2_;
          sVar46 = auVar38._14_2_;
          sVar94 = auVar61._0_2_;
          sVar103 = auVar61._2_2_;
          sVar105 = auVar61._4_2_;
          sVar107 = auVar61._6_2_;
          sVar109 = auVar61._8_2_;
          sVar111 = auVar61._10_2_;
          sVar113 = auVar61._12_2_;
          sVar115 = auVar61._14_2_;
          sVar116 = auVar62._0_2_;
          sVar60 = auVar62._2_2_;
          sVar121 = auVar62._4_2_;
          sVar130 = auVar62._6_2_;
          sVar131 = auVar62._8_2_;
          sVar134 = auVar62._10_2_;
          sVar135 = auVar62._12_2_;
          sVar137 = auVar62._14_2_;
          if (BVar27 == 0) break;
          lVar25 = 0;
          if (BVar27 != 0) {
            for (; (BVar27 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar32 = -1L << ((byte)lVar25 & 0x3f);
          uVar23 = (uint)((int)lVar25 << 3) | uVar20;
          uVar24 = uVar21;
          if (uVar21 <= uVar23 && uVar23 - uVar21 != 0) {
            uVar28 = -uVar139;
            if (0 < (int)uVar139) {
              uVar28 = uVar139;
            }
            uVar22 = 0xff;
            if (uVar28 < 0xff) {
              uVar22 = uVar28;
            }
            uVar24 = uVar23;
            if (uVar139 != 0) {
              uVar18 = uVar23 - uVar21 >> 2;
              if (uVar28 < 0xff) {
                auVar76 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
                auVar64._0_4_ = auVar76._0_4_;
                auVar64._4_4_ = auVar64._0_4_;
                auVar64._8_4_ = auVar64._0_4_;
                auVar64._12_4_ = auVar64._0_4_;
                sVar138 = auVar76._0_2_;
                sVar141 = auVar76._2_2_;
                auVar64 = auVar64 ^ auVar50;
                sVar93 = sVar138 * sVar37 + sVar94;
                sVar102 = sVar141 * sVar40 + sVar103;
                sVar104 = sVar138 * sVar41 + sVar105;
                sVar106 = sVar141 * sVar42 + sVar107;
                sVar108 = sVar138 * sVar43 + sVar109;
                sVar110 = sVar141 * sVar44 + sVar111;
                sVar112 = sVar138 * sVar45 + sVar113;
                sVar114 = sVar141 * sVar46 + sVar115;
                while( true ) {
                  sVar91 = auVar64._0_2_;
                  sVar66 = auVar64._2_2_;
                  sVar67 = auVar64._4_2_;
                  sVar68 = auVar64._6_2_;
                  sVar69 = auVar64._8_2_;
                  sVar70 = auVar64._10_2_;
                  sVar71 = auVar64._12_2_;
                  sVar73 = auVar64._14_2_;
                  if (uVar18 < 2) break;
                  auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                  auVar95 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10);
                  auVar123 = pmovzxbw(in_XMM13,auVar76);
                  auVar149 = pmovzxbw(in_XMM15,auVar95);
                  auVar142._0_2_ = (ushort)auVar76[8] * sVar91 + sVar93;
                  auVar142._2_2_ = (ushort)auVar76[9] * sVar66 + sVar102;
                  auVar142._4_2_ = (ushort)auVar76[10] * sVar67 + sVar104;
                  auVar142._6_2_ = (ushort)auVar76[0xb] * sVar68 + sVar106;
                  auVar142._8_2_ = (ushort)auVar76[0xc] * sVar69 + sVar108;
                  auVar142._10_2_ = (ushort)auVar76[0xd] * sVar70 + sVar110;
                  auVar142._12_2_ = (ushort)auVar76[0xe] * sVar71 + sVar112;
                  auVar142._14_2_ = (ushort)auVar76[0xf] * sVar73 + sVar114;
                  auVar143 = pmulhuw(auVar142,auVar15);
                  auVar117._0_2_ = (ushort)auVar95[8] * sVar91 + sVar93;
                  auVar117._2_2_ = (ushort)auVar95[9] * sVar66 + sVar102;
                  auVar117._4_2_ = (ushort)auVar95[10] * sVar67 + sVar104;
                  auVar117._6_2_ = (ushort)auVar95[0xb] * sVar68 + sVar106;
                  auVar117._8_2_ = (ushort)auVar95[0xc] * sVar69 + sVar108;
                  auVar117._10_2_ = (ushort)auVar95[0xd] * sVar70 + sVar110;
                  auVar117._12_2_ = (ushort)auVar95[0xe] * sVar71 + sVar112;
                  auVar117._14_2_ = (ushort)auVar95[0xf] * sVar73 + sVar114;
                  auVar76 = pmulhuw(auVar117,auVar15);
                  auVar124._0_2_ = auVar123._0_2_ * sVar91 + sVar93;
                  auVar124._2_2_ = auVar123._2_2_ * sVar66 + sVar102;
                  auVar124._4_2_ = auVar123._4_2_ * sVar67 + sVar104;
                  auVar124._6_2_ = auVar123._6_2_ * sVar68 + sVar106;
                  auVar124._8_2_ = auVar123._8_2_ * sVar69 + sVar108;
                  auVar124._10_2_ = auVar123._10_2_ * sVar70 + sVar110;
                  auVar124._12_2_ = auVar123._12_2_ * sVar71 + sVar112;
                  auVar124._14_2_ = auVar123._14_2_ * sVar73 + sVar114;
                  auVar95 = pmulhuw(auVar124,auVar15);
                  sVar7 = auVar95._0_2_;
                  sVar8 = auVar95._2_2_;
                  in_XMM13[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar95[2] - (0xff < sVar8);
                  in_XMM13[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0] - (0xff < sVar7);
                  sVar7 = auVar95._4_2_;
                  in_XMM13[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[4] - (0xff < sVar7);
                  sVar7 = auVar95._6_2_;
                  in_XMM13[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[6] - (0xff < sVar7);
                  sVar7 = auVar95._8_2_;
                  in_XMM13[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[8] - (0xff < sVar7);
                  sVar7 = auVar95._10_2_;
                  in_XMM13[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[10] - (0xff < sVar7);
                  sVar7 = auVar95._12_2_;
                  in_XMM13[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xc] - (0xff < sVar7);
                  sVar7 = auVar95._14_2_;
                  in_XMM13[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xe] - (0xff < sVar7);
                  sVar7 = auVar143._0_2_;
                  in_XMM13[8] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[0] - (0xff < sVar7);
                  sVar7 = auVar143._2_2_;
                  in_XMM13[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[2] - (0xff < sVar7);
                  sVar7 = auVar143._4_2_;
                  in_XMM13[10] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[4] - (0xff < sVar7);
                  sVar7 = auVar143._6_2_;
                  in_XMM13[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[6] - (0xff < sVar7);
                  sVar7 = auVar143._8_2_;
                  in_XMM13[0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[8] - (0xff < sVar7);
                  sVar7 = auVar143._10_2_;
                  in_XMM13[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[10] - (0xff < sVar7);
                  sVar7 = auVar143._12_2_;
                  in_XMM13[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[0xc] - (0xff < sVar7);
                  sVar7 = auVar143._14_2_;
                  in_XMM13[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar143[0xe] - (0xff < sVar7);
                  auVar150._0_2_ = auVar149._0_2_ * sVar91 + sVar93;
                  auVar150._2_2_ = auVar149._2_2_ * sVar66 + sVar102;
                  auVar150._4_2_ = auVar149._4_2_ * sVar67 + sVar104;
                  auVar150._6_2_ = auVar149._6_2_ * sVar68 + sVar106;
                  auVar150._8_2_ = auVar149._8_2_ * sVar69 + sVar108;
                  auVar150._10_2_ = auVar149._10_2_ * sVar70 + sVar110;
                  auVar150._12_2_ = auVar149._12_2_ * sVar71 + sVar112;
                  auVar150._14_2_ = auVar149._14_2_ * sVar73 + sVar114;
                  auVar95 = pmulhuw(auVar150,auVar15);
                  sVar91 = auVar95._0_2_;
                  sVar66 = auVar95._2_2_;
                  in_XMM15[1] = (0 < sVar66) * (sVar66 < 0x100) * auVar95[2] - (0xff < sVar66);
                  in_XMM15[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0] - (0xff < sVar91);
                  sVar91 = auVar95._4_2_;
                  in_XMM15[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[4] - (0xff < sVar91);
                  sVar91 = auVar95._6_2_;
                  in_XMM15[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[6] - (0xff < sVar91);
                  sVar91 = auVar95._8_2_;
                  in_XMM15[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[8] - (0xff < sVar91);
                  sVar91 = auVar95._10_2_;
                  in_XMM15[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[10] - (0xff < sVar91);
                  sVar91 = auVar95._12_2_;
                  in_XMM15[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0xc] - (0xff < sVar91);
                  sVar91 = auVar95._14_2_;
                  in_XMM15[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0xe] - (0xff < sVar91);
                  sVar91 = auVar76._0_2_;
                  in_XMM15[8] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0] - (0xff < sVar91);
                  sVar91 = auVar76._2_2_;
                  in_XMM15[9] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[2] - (0xff < sVar91);
                  sVar91 = auVar76._4_2_;
                  in_XMM15[10] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[4] - (0xff < sVar91);
                  sVar91 = auVar76._6_2_;
                  in_XMM15[0xb] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[6] - (0xff < sVar91);
                  sVar91 = auVar76._8_2_;
                  in_XMM15[0xc] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[8] - (0xff < sVar91);
                  sVar91 = auVar76._10_2_;
                  in_XMM15[0xd] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[10] - (0xff < sVar91);
                  sVar91 = auVar76._12_2_;
                  in_XMM15[0xe] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0xc] - (0xff < sVar91);
                  sVar91 = auVar76._14_2_;
                  in_XMM15[0xf] = (0 < sVar91) * (sVar91 < 0x100) * auVar76[0xe] - (0xff < sVar91);
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM13;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = in_XMM15;
                  uVar21 = uVar21 + 8;
                  uVar18 = uVar18 - 2;
                }
                if (uVar18 != 0) {
                  auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
                  auVar95 = pmovzxbw(in_XMM13,auVar76);
                  auVar118._0_2_ = (ushort)auVar76[8] * sVar91 + sVar93;
                  auVar118._2_2_ = (ushort)auVar76[9] * sVar66 + sVar102;
                  auVar118._4_2_ = (ushort)auVar76[10] * sVar67 + sVar104;
                  auVar118._6_2_ = (ushort)auVar76[0xb] * sVar68 + sVar106;
                  auVar118._8_2_ = (ushort)auVar76[0xc] * sVar69 + sVar108;
                  auVar118._10_2_ = (ushort)auVar76[0xd] * sVar70 + sVar110;
                  auVar118._12_2_ = (ushort)auVar76[0xe] * sVar71 + sVar112;
                  auVar118._14_2_ = (ushort)auVar76[0xf] * sVar73 + sVar114;
                  auVar76 = pmulhuw(auVar118,auVar15);
                  auVar126._0_2_ = auVar95._0_2_ * sVar91 + sVar93;
                  auVar126._2_2_ = auVar95._2_2_ * sVar66 + sVar102;
                  auVar126._4_2_ = auVar95._4_2_ * sVar67 + sVar104;
                  auVar126._6_2_ = auVar95._6_2_ * sVar68 + sVar106;
                  auVar126._8_2_ = auVar95._8_2_ * sVar69 + sVar108;
                  auVar126._10_2_ = auVar95._10_2_ * sVar70 + sVar110;
                  auVar126._12_2_ = auVar95._12_2_ * sVar71 + sVar112;
                  auVar126._14_2_ = auVar95._14_2_ * sVar73 + sVar114;
                  auVar95 = pmulhuw(auVar126,auVar15);
                  sVar93 = auVar95._0_2_;
                  sVar102 = auVar95._2_2_;
                  in_XMM13[1] = (0 < sVar102) * (sVar102 < 0x100) * auVar95[2] - (0xff < sVar102);
                  in_XMM13[0] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0] - (0xff < sVar93);
                  sVar93 = auVar95._4_2_;
                  in_XMM13[2] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[4] - (0xff < sVar93);
                  sVar93 = auVar95._6_2_;
                  in_XMM13[3] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[6] - (0xff < sVar93);
                  sVar93 = auVar95._8_2_;
                  in_XMM13[4] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[8] - (0xff < sVar93);
                  sVar93 = auVar95._10_2_;
                  in_XMM13[5] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[10] - (0xff < sVar93);
                  sVar93 = auVar95._12_2_;
                  in_XMM13[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xc] - (0xff < sVar93);
                  sVar93 = auVar95._14_2_;
                  in_XMM13[7] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xe] - (0xff < sVar93);
                  sVar93 = auVar76._0_2_;
                  in_XMM13[8] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0] - (0xff < sVar93);
                  sVar93 = auVar76._2_2_;
                  in_XMM13[9] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[2] - (0xff < sVar93);
                  sVar93 = auVar76._4_2_;
                  in_XMM13[10] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[4] - (0xff < sVar93);
                  sVar93 = auVar76._6_2_;
                  in_XMM13[0xb] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[6] - (0xff < sVar93);
                  sVar93 = auVar76._8_2_;
                  in_XMM13[0xc] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[8] - (0xff < sVar93);
                  sVar93 = auVar76._10_2_;
                  in_XMM13[0xd] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[10] - (0xff < sVar93);
                  sVar93 = auVar76._12_2_;
                  in_XMM13[0xe] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xc] - (0xff < sVar93);
                  sVar93 = auVar76._14_2_;
                  in_XMM13[0xf] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xe] - (0xff < sVar93);
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM13;
                  uVar21 = uVar21 + 4;
                }
                for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
                  auVar76 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar21 * 4)),
                                     ZEXT416(*(uint *)(puVar35 + uVar21 * 4)));
                  auVar97._0_2_ = auVar76._0_2_ * sVar91 + sVar138 * sVar37 + sVar116;
                  auVar97._2_2_ = auVar76._2_2_ * sVar66 + sVar141 * sVar40 + sVar60;
                  auVar97._4_2_ = auVar76._4_2_ * sVar67 + sVar138 * sVar41 + sVar121;
                  auVar97._6_2_ = auVar76._6_2_ * sVar68 + sVar141 * sVar42 + sVar130;
                  auVar97._8_2_ = auVar76._8_2_ * sVar69 + sVar138 * sVar43 + sVar131;
                  auVar97._10_2_ = auVar76._10_2_ * sVar70 + sVar141 * sVar44 + sVar134;
                  auVar97._12_2_ = auVar76._12_2_ * sVar71 + sVar138 * sVar45 + sVar135;
                  auVar97._14_2_ = auVar76._14_2_ * sVar73 + sVar141 * sVar46 + sVar137;
                  auVar76 = pmulhuw(auVar97,auVar16);
                  sVar93 = auVar76._0_2_;
                  sVar102 = auVar76._2_2_;
                  sVar104 = auVar76._4_2_;
                  sVar106 = auVar76._6_2_;
                  *(uint *)(puVar35 + uVar21 * 4) =
                       CONCAT13((0 < sVar106) * (sVar106 < 0x100) * auVar76[6] - (0xff < sVar106),
                                CONCAT12((0 < sVar104) * (sVar104 < 0x100) * auVar76[4] -
                                         (0xff < sVar104),
                                         CONCAT11((0 < sVar102) * (sVar102 < 0x100) * auVar76[2] -
                                                  (0xff < sVar102),
                                                  (0 < sVar93) * (sVar93 < 0x100) * auVar76[0] -
                                                  (0xff < sVar93))));
                }
              }
              else {
                puVar26 = (uint32_t *)(puVar35 + uVar21 * 4);
                for (; 7 < uVar18; uVar18 = uVar18 - 8) {
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x20) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x30) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x40) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x50) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x60) = auVar39;
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x70) = auVar39;
                  uVar21 = uVar21 + 0x20;
                  puVar26 = puVar26 + 0x20;
                }
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar39;
                  uVar21 = uVar21 + 4;
                  puVar26 = puVar26 + 4;
                }
                for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
                  *puVar26 = uVar17;
                  puVar26 = puVar26 + 1;
                }
              }
            }
          }
          if (BVar27 == uVar32) {
            uVar21 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
            if (uVar30 < uVar21) {
              uVar21 = uVar30;
            }
            BVar27 = 0;
          }
          else {
            uVar32 = uVar32 ^ BVar27;
            lVar25 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            BVar27 = -1L << ((byte)lVar25 & 0x3f) ^ uVar32;
            uVar21 = (uint)((int)lVar25 << 3) | uVar20;
          }
          sVar138 = auVar50._0_2_;
          sVar141 = auVar50._2_2_;
          sVar93 = auVar50._4_2_;
          sVar102 = auVar50._6_2_;
          sVar104 = auVar50._8_2_;
          sVar106 = auVar50._10_2_;
          sVar108 = auVar50._12_2_;
          sVar110 = auVar50._14_2_;
          uVar28 = 0;
          uVar22 = 0;
          uVar72 = 0;
          if (3 < uVar21 - uVar24) {
            uVar23 = uVar21 - uVar24 >> 2;
            while (bVar36 = uVar23 != 0, uVar23 = uVar23 - 1, uVar28 = uVar139, uVar22 = uVar139,
                  uVar72 = uVar139, bVar36) {
              pCVar1 = pCVar34 + uVar24;
              iVar47 = pCVar1->cover;
              pCVar3 = pCVar34 + uVar24 + 2;
              iVar132 = iVar47 + pCVar1[1].cover;
              auVar14._4_4_ = iVar132;
              auVar14._0_4_ = iVar47;
              auVar75._0_4_ = pCVar1->area >> 9;
              auVar75._4_4_ = pCVar1[1].area >> 9;
              auVar75._8_4_ = pCVar3->area >> 9;
              auVar75._12_4_ = pCVar3[1].area >> 9;
              auVar14._8_8_ = 0;
              iVar122 = iVar47 + uVar139;
              iVar133 = iVar132 + uVar139;
              iVar136 = pCVar1[1].cover + pCVar3->cover + uVar139;
              uVar139 = pCVar3->cover + pCVar3[1].cover + uVar139 + iVar132;
              auVar125._0_4_ = iVar122 - auVar75._0_4_;
              auVar125._4_4_ = iVar133 - auVar75._4_4_;
              auVar125._8_4_ = (iVar136 + iVar47) - auVar75._8_4_;
              auVar125._12_4_ = uVar139 - auVar75._12_4_;
              auVar76 = pabsd(auVar75,auVar125);
              auVar76 = packssdw(auVar76,auVar76);
              sVar112 = auVar76._0_2_;
              sVar114 = auVar76._2_2_;
              sVar91 = auVar76._4_2_;
              uVar90 = (ushort)(sVar93 < sVar91) * sVar93 | (ushort)(sVar93 >= sVar91) * sVar91;
              sVar91 = auVar76._6_2_;
              uVar92 = (ushort)(sVar102 < sVar91) * sVar102 | (ushort)(sVar102 >= sVar91) * sVar91;
              auVar78._0_8_ =
                   CONCAT26(uVar92,CONCAT24(uVar90,CONCAT22((ushort)(sVar141 < sVar114) * sVar141 |
                                                            (ushort)(sVar141 >= sVar114) * sVar114,
                                                            (ushort)(sVar138 < sVar112) * sVar138 |
                                                            (ushort)(sVar138 >= sVar112) * sVar112))
                           );
              sVar112 = auVar76._8_2_;
              auVar74._0_10_ =
                   CONCAT28((ushort)(sVar104 < sVar112) * sVar104 |
                            (ushort)(sVar104 >= sVar112) * sVar112,auVar78._0_8_);
              sVar112 = auVar76._10_2_;
              auVar74._10_2_ =
                   (ushort)(sVar106 < sVar112) * sVar106 | (ushort)(sVar106 >= sVar112) * sVar112;
              sVar112 = auVar76._12_2_;
              sVar114 = auVar76._14_2_;
              auVar77._12_2_ =
                   (ushort)(sVar108 < sVar112) * sVar108 | (ushort)(sVar108 >= sVar112) * sVar112;
              auVar77._0_12_ = auVar74;
              auVar77._14_2_ =
                   (ushort)(sVar110 < sVar114) * sVar110 | (ushort)(sVar110 >= sVar114) * sVar114;
              auVar95 = pshuflw(auVar14 << 0x40,auVar77,0x50);
              auVar80._12_2_ = uVar92;
              auVar80._0_12_ = auVar74;
              auVar80._14_2_ = uVar92;
              auVar79._12_4_ = auVar80._12_4_;
              auVar79._10_2_ = uVar90;
              auVar79._0_10_ = auVar74._0_10_;
              auVar78._10_6_ = auVar79._10_6_;
              auVar78._8_2_ = uVar90;
              *(undefined1 (*) [16])(pCVar34 + uVar24) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(pCVar34 + uVar24 + 2) = (undefined1  [16])0x0;
              auVar76 = *(undefined1 (*) [16])(puVar35 + uVar24 * 4);
              in_XMM13 = pmovzxbw(auVar125,auVar76);
              auVar96._0_4_ = auVar95._0_4_;
              auVar96._4_4_ = auVar96._0_4_;
              auVar96._8_4_ = auVar95._4_4_;
              auVar96._12_4_ = auVar95._4_4_;
              auVar81._4_4_ = auVar78._8_4_;
              auVar81._0_4_ = auVar78._8_4_;
              auVar81._8_4_ = auVar79._12_4_;
              auVar81._12_4_ = auVar79._12_4_;
              auVar96 = auVar96 ^ auVar50;
              auVar81 = auVar81 ^ auVar50;
              auVar144._0_2_ = auVar95._0_2_ * sVar37 + sVar94 + auVar96._0_2_ * in_XMM13._0_2_;
              auVar144._2_2_ = auVar95._2_2_ * sVar40 + sVar103 + auVar96._2_2_ * in_XMM13._2_2_;
              auVar144._4_2_ = auVar95._0_2_ * sVar41 + sVar105 + auVar96._4_2_ * in_XMM13._4_2_;
              auVar144._6_2_ = auVar95._2_2_ * sVar42 + sVar107 + auVar96._6_2_ * in_XMM13._6_2_;
              auVar144._8_2_ = auVar95._4_2_ * sVar43 + sVar109 + auVar96._8_2_ * in_XMM13._8_2_;
              auVar144._10_2_ = auVar95._6_2_ * sVar44 + sVar111 + auVar96._10_2_ * in_XMM13._10_2_;
              auVar144._12_2_ = auVar95._4_2_ * sVar45 + sVar113 + auVar96._12_2_ * in_XMM13._12_2_;
              auVar144._14_2_ = auVar95._6_2_ * sVar46 + sVar115 + auVar96._14_2_ * in_XMM13._14_2_;
              auVar95 = pmulhuw(auVar144,auVar15);
              auVar151._0_2_ = uVar90 * sVar37 + sVar94 + auVar81._0_2_ * (ushort)auVar76[8];
              auVar151._2_2_ = uVar90 * sVar40 + sVar103 + auVar81._2_2_ * (ushort)auVar76[9];
              auVar151._4_2_ = uVar90 * sVar41 + sVar105 + auVar81._4_2_ * (ushort)auVar76[10];
              auVar151._6_2_ = uVar90 * sVar42 + sVar107 + auVar81._6_2_ * (ushort)auVar76[0xb];
              auVar151._8_2_ = uVar92 * sVar43 + sVar109 + auVar81._8_2_ * (ushort)auVar76[0xc];
              auVar151._10_2_ = uVar92 * sVar44 + sVar111 + auVar81._10_2_ * (ushort)auVar76[0xd];
              auVar151._12_2_ = uVar92 * sVar45 + sVar113 + auVar81._12_2_ * (ushort)auVar76[0xe];
              auVar151._14_2_ = uVar92 * sVar46 + sVar115 + auVar81._14_2_ * (ushort)auVar76[0xf];
              in_XMM15 = pmulhuw(auVar151,auVar15);
              sVar112 = auVar95._0_2_;
              sVar114 = auVar95._2_2_;
              sVar91 = auVar95._4_2_;
              sVar66 = auVar95._6_2_;
              sVar67 = auVar95._8_2_;
              sVar68 = auVar95._10_2_;
              sVar69 = auVar95._12_2_;
              sVar70 = auVar95._14_2_;
              sVar71 = in_XMM15._0_2_;
              sVar73 = in_XMM15._2_2_;
              sVar7 = in_XMM15._4_2_;
              sVar8 = in_XMM15._6_2_;
              sVar9 = in_XMM15._8_2_;
              sVar10 = in_XMM15._10_2_;
              sVar11 = in_XMM15._12_2_;
              sVar12 = in_XMM15._14_2_;
              puVar2 = puVar35 + uVar24 * 4;
              *puVar2 = (0 < sVar112) * (sVar112 < 0x100) * auVar95[0] - (0xff < sVar112);
              puVar2[1] = (0 < sVar114) * (sVar114 < 0x100) * auVar95[2] - (0xff < sVar114);
              puVar2[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[4] - (0xff < sVar91);
              puVar2[3] = (0 < sVar66) * (sVar66 < 0x100) * auVar95[6] - (0xff < sVar66);
              puVar2[4] = (0 < sVar67) * (sVar67 < 0x100) * auVar95[8] - (0xff < sVar67);
              puVar2[5] = (0 < sVar68) * (sVar68 < 0x100) * auVar95[10] - (0xff < sVar68);
              puVar2[6] = (0 < sVar69) * (sVar69 < 0x100) * auVar95[0xc] - (0xff < sVar69);
              puVar2[7] = (0 < sVar70) * (sVar70 < 0x100) * auVar95[0xe] - (0xff < sVar70);
              puVar2[8] = (0 < sVar71) * (sVar71 < 0x100) * in_XMM15[0] - (0xff < sVar71);
              puVar2[9] = (0 < sVar73) * (sVar73 < 0x100) * in_XMM15[2] - (0xff < sVar73);
              puVar2[10] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM15[4] - (0xff < sVar7);
              puVar2[0xb] = (0 < sVar8) * (sVar8 < 0x100) * in_XMM15[6] - (0xff < sVar8);
              puVar2[0xc] = (0 < sVar9) * (sVar9 < 0x100) * in_XMM15[8] - (0xff < sVar9);
              puVar2[0xd] = (0 < sVar10) * (sVar10 < 0x100) * in_XMM15[10] - (0xff < sVar10);
              puVar2[0xe] = (0 < sVar11) * (sVar11 < 0x100) * in_XMM15[0xc] - (0xff < sVar11);
              puVar2[0xf] = (0 < sVar12) * (sVar12 < 0x100) * in_XMM15[0xe] - (0xff < sVar12);
              uVar24 = uVar24 + 4;
            }
          }
          for (; uVar24 < uVar21; uVar24 = uVar24 + 1) {
            iVar47 = pCVar34[uVar24].cover;
            iVar122 = pCVar34[uVar24].area;
            pCVar34[uVar24].cover = 0;
            pCVar34[uVar24].area = 0;
            uVar139 = uVar139 + iVar47;
            auVar82._0_4_ = uVar139 - (iVar122 >> 9);
            auVar82._4_4_ = uVar28;
            auVar82._8_4_ = uVar22;
            auVar82._12_4_ = uVar72;
            auVar76 = pabsd(auVar82,auVar82);
            auVar76 = packssdw(auVar76,auVar76);
            auVar76 = pshuflw(auVar76,auVar76,0);
            sVar94 = auVar76._0_2_;
            auVar83._0_2_ =
                 (ushort)(sVar138 < sVar94) * sVar138 | (ushort)(sVar138 >= sVar94) * sVar94;
            sVar94 = auVar76._2_2_;
            auVar83._2_2_ =
                 (ushort)(sVar141 < sVar94) * sVar141 | (ushort)(sVar141 >= sVar94) * sVar94;
            sVar94 = auVar76._4_2_;
            auVar83._4_2_ = (ushort)(sVar93 < sVar94) * sVar93 | (ushort)(sVar93 >= sVar94) * sVar94
            ;
            sVar94 = auVar76._6_2_;
            auVar83._6_2_ =
                 (ushort)(sVar102 < sVar94) * sVar102 | (ushort)(sVar102 >= sVar94) * sVar94;
            sVar94 = auVar76._8_2_;
            auVar83._8_2_ =
                 (ushort)(sVar104 < sVar94) * sVar104 | (ushort)(sVar104 >= sVar94) * sVar94;
            sVar94 = auVar76._10_2_;
            auVar83._10_2_ =
                 (ushort)(sVar106 < sVar94) * sVar106 | (ushort)(sVar106 >= sVar94) * sVar94;
            sVar94 = auVar76._12_2_;
            sVar103 = auVar76._14_2_;
            auVar83._12_2_ =
                 (ushort)(sVar108 < sVar94) * sVar108 | (ushort)(sVar108 >= sVar94) * sVar94;
            auVar83._14_2_ =
                 (ushort)(sVar110 < sVar103) * sVar110 | (ushort)(sVar110 >= sVar103) * sVar103;
            auVar95 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar24 * 4)),
                               ZEXT416(*(uint *)(puVar35 + uVar24 * 4)));
            auVar76 = auVar83 ^ auVar63;
            auVar84._0_2_ = auVar76._0_2_ * auVar95._0_2_ + auVar83._0_2_ * sVar37 + sVar116;
            auVar84._2_2_ = auVar76._2_2_ * auVar95._2_2_ + auVar83._2_2_ * sVar40 + sVar60;
            auVar84._4_2_ = auVar76._4_2_ * auVar95._4_2_ + auVar83._4_2_ * sVar41 + sVar121;
            auVar84._6_2_ = auVar76._6_2_ * auVar95._6_2_ + auVar83._6_2_ * sVar42 + sVar130;
            auVar84._8_2_ = auVar76._8_2_ * auVar95._8_2_ + auVar83._8_2_ * sVar43 + sVar131;
            auVar84._10_2_ = auVar76._10_2_ * auVar95._10_2_ + auVar83._10_2_ * sVar44 + sVar134;
            auVar84._12_2_ = auVar76._12_2_ * auVar95._12_2_ + auVar83._12_2_ * sVar45 + sVar135;
            auVar84._14_2_ = auVar76._14_2_ * auVar95._14_2_ + auVar83._14_2_ * sVar46 + sVar137;
            auVar76 = pmulhuw(auVar84,auVar16);
            sVar94 = auVar76._0_2_;
            sVar103 = auVar76._2_2_;
            sVar105 = auVar76._4_2_;
            sVar107 = auVar76._6_2_;
            *(uint *)(puVar35 + uVar24 * 4) =
                 CONCAT13((0 < sVar107) * (sVar107 < 0x100) * auVar76[6] - (0xff < sVar107),
                          CONCAT12((0 < sVar105) * (sVar105 < 0x100) * auVar76[4] - (0xff < sVar105)
                                   ,CONCAT11((0 < sVar103) * (sVar103 < 0x100) * auVar76[2] -
                                             (0xff < sVar103),
                                             (0 < sVar94) * (sVar94 < 0x100) * auVar76[0] -
                                             (0xff < sVar94))));
          }
        }
        pBVar33 = pBVar33 + 1;
        sVar19 = sVar19 - 1;
        uVar20 = uVar30;
      } while (sVar19 != 0);
      uVar20 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
      uVar30 = uVar20 - uVar21;
      if (uVar21 <= uVar20 && uVar30 != 0) {
        uVar28 = -uVar139;
        if (0 < (int)uVar139) {
          uVar28 = uVar139;
        }
        uVar22 = 0xff;
        if (uVar28 < 0xff) {
          uVar22 = uVar28;
        }
        if (uVar139 != 0) {
          uVar24 = uVar30 >> 2;
          if (uVar28 < 0xff) {
            auVar76 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
            auVar65._0_4_ = auVar76._0_4_;
            auVar65._4_4_ = auVar65._0_4_;
            auVar65._8_4_ = auVar65._0_4_;
            auVar65._12_4_ = auVar65._0_4_;
            sVar138 = auVar76._0_2_;
            sVar141 = auVar76._2_2_;
            auVar65 = auVar65 ^ auVar50;
            sVar94 = sVar138 * sVar37 + sVar94;
            sVar103 = sVar141 * sVar40 + sVar103;
            sVar105 = sVar138 * sVar41 + sVar105;
            sVar107 = sVar141 * sVar42 + sVar107;
            sVar109 = sVar138 * sVar43 + sVar109;
            sVar111 = sVar141 * sVar44 + sVar111;
            sVar113 = sVar138 * sVar45 + sVar113;
            sVar115 = sVar141 * sVar46 + sVar115;
            uVar23 = uVar24;
            while( true ) {
              sVar93 = auVar65._0_2_;
              sVar102 = auVar65._2_2_;
              sVar104 = auVar65._4_2_;
              sVar106 = auVar65._6_2_;
              sVar108 = auVar65._8_2_;
              sVar110 = auVar65._10_2_;
              sVar112 = auVar65._12_2_;
              sVar114 = auVar65._14_2_;
              if (uVar23 < 2) break;
              auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
              auVar95 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10);
              auVar123 = pmovzxbw(in_XMM13,auVar76);
              auVar149 = pmovzxbw(in_XMM15,auVar95);
              auVar145._0_2_ = (ushort)auVar76[8] * sVar93 + sVar94;
              auVar145._2_2_ = (ushort)auVar76[9] * sVar102 + sVar103;
              auVar145._4_2_ = (ushort)auVar76[10] * sVar104 + sVar105;
              auVar145._6_2_ = (ushort)auVar76[0xb] * sVar106 + sVar107;
              auVar145._8_2_ = (ushort)auVar76[0xc] * sVar108 + sVar109;
              auVar145._10_2_ = (ushort)auVar76[0xd] * sVar110 + sVar111;
              auVar145._12_2_ = (ushort)auVar76[0xe] * sVar112 + sVar113;
              auVar145._14_2_ = (ushort)auVar76[0xf] * sVar114 + sVar115;
              auVar143 = pmulhuw(auVar145,auVar15);
              auVar119._0_2_ = (ushort)auVar95[8] * sVar93 + sVar94;
              auVar119._2_2_ = (ushort)auVar95[9] * sVar102 + sVar103;
              auVar119._4_2_ = (ushort)auVar95[10] * sVar104 + sVar105;
              auVar119._6_2_ = (ushort)auVar95[0xb] * sVar106 + sVar107;
              auVar119._8_2_ = (ushort)auVar95[0xc] * sVar108 + sVar109;
              auVar119._10_2_ = (ushort)auVar95[0xd] * sVar110 + sVar111;
              auVar119._12_2_ = (ushort)auVar95[0xe] * sVar112 + sVar113;
              auVar119._14_2_ = (ushort)auVar95[0xf] * sVar114 + sVar115;
              auVar76 = pmulhuw(auVar119,auVar15);
              auVar127._0_2_ = auVar123._0_2_ * sVar93 + sVar94;
              auVar127._2_2_ = auVar123._2_2_ * sVar102 + sVar103;
              auVar127._4_2_ = auVar123._4_2_ * sVar104 + sVar105;
              auVar127._6_2_ = auVar123._6_2_ * sVar106 + sVar107;
              auVar127._8_2_ = auVar123._8_2_ * sVar108 + sVar109;
              auVar127._10_2_ = auVar123._10_2_ * sVar110 + sVar111;
              auVar127._12_2_ = auVar123._12_2_ * sVar112 + sVar113;
              auVar127._14_2_ = auVar123._14_2_ * sVar114 + sVar115;
              auVar95 = pmulhuw(auVar127,auVar15);
              sVar91 = auVar95._0_2_;
              sVar66 = auVar95._2_2_;
              in_XMM13[1] = (0 < sVar66) * (sVar66 < 0x100) * auVar95[2] - (0xff < sVar66);
              in_XMM13[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0] - (0xff < sVar91);
              sVar91 = auVar95._4_2_;
              in_XMM13[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[4] - (0xff < sVar91);
              sVar91 = auVar95._6_2_;
              in_XMM13[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[6] - (0xff < sVar91);
              sVar91 = auVar95._8_2_;
              in_XMM13[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[8] - (0xff < sVar91);
              sVar91 = auVar95._10_2_;
              in_XMM13[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[10] - (0xff < sVar91);
              sVar91 = auVar95._12_2_;
              in_XMM13[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0xc] - (0xff < sVar91);
              sVar91 = auVar95._14_2_;
              in_XMM13[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar95[0xe] - (0xff < sVar91);
              sVar91 = auVar143._0_2_;
              in_XMM13[8] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[0] - (0xff < sVar91);
              sVar91 = auVar143._2_2_;
              in_XMM13[9] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[2] - (0xff < sVar91);
              sVar91 = auVar143._4_2_;
              in_XMM13[10] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[4] - (0xff < sVar91);
              sVar91 = auVar143._6_2_;
              in_XMM13[0xb] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[6] - (0xff < sVar91);
              sVar91 = auVar143._8_2_;
              in_XMM13[0xc] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[8] - (0xff < sVar91);
              sVar91 = auVar143._10_2_;
              in_XMM13[0xd] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[10] - (0xff < sVar91);
              sVar91 = auVar143._12_2_;
              in_XMM13[0xe] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[0xc] - (0xff < sVar91);
              sVar91 = auVar143._14_2_;
              in_XMM13[0xf] = (0 < sVar91) * (sVar91 < 0x100) * auVar143[0xe] - (0xff < sVar91);
              auVar152._0_2_ = auVar149._0_2_ * sVar93 + sVar94;
              auVar152._2_2_ = auVar149._2_2_ * sVar102 + sVar103;
              auVar152._4_2_ = auVar149._4_2_ * sVar104 + sVar105;
              auVar152._6_2_ = auVar149._6_2_ * sVar106 + sVar107;
              auVar152._8_2_ = auVar149._8_2_ * sVar108 + sVar109;
              auVar152._10_2_ = auVar149._10_2_ * sVar110 + sVar111;
              auVar152._12_2_ = auVar149._12_2_ * sVar112 + sVar113;
              auVar152._14_2_ = auVar149._14_2_ * sVar114 + sVar115;
              auVar95 = pmulhuw(auVar152,auVar15);
              sVar93 = auVar95._0_2_;
              sVar102 = auVar95._2_2_;
              in_XMM15[1] = (0 < sVar102) * (sVar102 < 0x100) * auVar95[2] - (0xff < sVar102);
              in_XMM15[0] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0] - (0xff < sVar93);
              sVar93 = auVar95._4_2_;
              in_XMM15[2] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[4] - (0xff < sVar93);
              sVar93 = auVar95._6_2_;
              in_XMM15[3] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[6] - (0xff < sVar93);
              sVar93 = auVar95._8_2_;
              in_XMM15[4] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[8] - (0xff < sVar93);
              sVar93 = auVar95._10_2_;
              in_XMM15[5] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[10] - (0xff < sVar93);
              sVar93 = auVar95._12_2_;
              in_XMM15[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xc] - (0xff < sVar93);
              sVar93 = auVar95._14_2_;
              in_XMM15[7] = (0 < sVar93) * (sVar93 < 0x100) * auVar95[0xe] - (0xff < sVar93);
              sVar93 = auVar76._0_2_;
              in_XMM15[8] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0] - (0xff < sVar93);
              sVar93 = auVar76._2_2_;
              in_XMM15[9] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[2] - (0xff < sVar93);
              sVar93 = auVar76._4_2_;
              in_XMM15[10] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[4] - (0xff < sVar93);
              sVar93 = auVar76._6_2_;
              in_XMM15[0xb] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[6] - (0xff < sVar93);
              sVar93 = auVar76._8_2_;
              in_XMM15[0xc] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[8] - (0xff < sVar93);
              sVar93 = auVar76._10_2_;
              in_XMM15[0xd] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[10] - (0xff < sVar93);
              sVar93 = auVar76._12_2_;
              in_XMM15[0xe] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xc] - (0xff < sVar93);
              sVar93 = auVar76._14_2_;
              in_XMM15[0xf] = (0 < sVar93) * (sVar93 < 0x100) * auVar76[0xe] - (0xff < sVar93);
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM13;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = in_XMM15;
              uVar21 = uVar21 + 8;
              uVar23 = uVar23 - 2;
            }
            if (uVar24 != (uVar30 >> 2 & 0x3ffffffffffffffe)) {
              auVar76 = *(undefined1 (*) [16])(puVar35 + uVar21 * 4);
              auVar95 = pmovzxbw(in_XMM13,auVar76);
              auVar120._0_2_ = (ushort)auVar76[8] * sVar93 + sVar94;
              auVar120._2_2_ = (ushort)auVar76[9] * sVar102 + sVar103;
              auVar120._4_2_ = (ushort)auVar76[10] * sVar104 + sVar105;
              auVar120._6_2_ = (ushort)auVar76[0xb] * sVar106 + sVar107;
              auVar120._8_2_ = (ushort)auVar76[0xc] * sVar108 + sVar109;
              auVar120._10_2_ = (ushort)auVar76[0xd] * sVar110 + sVar111;
              auVar120._12_2_ = (ushort)auVar76[0xe] * sVar112 + sVar113;
              auVar120._14_2_ = (ushort)auVar76[0xf] * sVar114 + sVar115;
              auVar76 = pmulhuw(auVar120,auVar15);
              auVar128._0_2_ = auVar95._0_2_ * sVar93 + sVar94;
              auVar128._2_2_ = auVar95._2_2_ * sVar102 + sVar103;
              auVar128._4_2_ = auVar95._4_2_ * sVar104 + sVar105;
              auVar128._6_2_ = auVar95._6_2_ * sVar106 + sVar107;
              auVar128._8_2_ = auVar95._8_2_ * sVar108 + sVar109;
              auVar128._10_2_ = auVar95._10_2_ * sVar110 + sVar111;
              auVar128._12_2_ = auVar95._12_2_ * sVar112 + sVar113;
              auVar128._14_2_ = auVar95._14_2_ * sVar114 + sVar115;
              auVar95 = pmulhuw(auVar128,auVar15);
              sVar94 = auVar95._0_2_;
              sVar103 = auVar95._2_2_;
              in_XMM13[1] = (0 < sVar103) * (sVar103 < 0x100) * auVar95[2] - (0xff < sVar103);
              in_XMM13[0] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[0] - (0xff < sVar94);
              sVar94 = auVar95._4_2_;
              in_XMM13[2] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[4] - (0xff < sVar94);
              sVar94 = auVar95._6_2_;
              in_XMM13[3] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[6] - (0xff < sVar94);
              sVar94 = auVar95._8_2_;
              in_XMM13[4] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[8] - (0xff < sVar94);
              sVar94 = auVar95._10_2_;
              in_XMM13[5] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[10] - (0xff < sVar94);
              sVar94 = auVar95._12_2_;
              in_XMM13[6] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[0xc] - (0xff < sVar94);
              sVar94 = auVar95._14_2_;
              in_XMM13[7] = (0 < sVar94) * (sVar94 < 0x100) * auVar95[0xe] - (0xff < sVar94);
              sVar94 = auVar76._0_2_;
              in_XMM13[8] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[0] - (0xff < sVar94);
              sVar94 = auVar76._2_2_;
              in_XMM13[9] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[2] - (0xff < sVar94);
              sVar94 = auVar76._4_2_;
              in_XMM13[10] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[4] - (0xff < sVar94);
              sVar94 = auVar76._6_2_;
              in_XMM13[0xb] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[6] - (0xff < sVar94);
              sVar94 = auVar76._8_2_;
              in_XMM13[0xc] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[8] - (0xff < sVar94);
              sVar94 = auVar76._10_2_;
              in_XMM13[0xd] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[10] - (0xff < sVar94);
              sVar94 = auVar76._12_2_;
              in_XMM13[0xe] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[0xc] - (0xff < sVar94);
              sVar94 = auVar76._14_2_;
              in_XMM13[0xf] = (0 < sVar94) * (sVar94 < 0x100) * auVar76[0xe] - (0xff < sVar94);
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = in_XMM13;
              uVar21 = uVar21 + 4;
            }
            for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
              auVar76 = pmovzxbw(ZEXT416(*(uint *)(puVar35 + uVar21 * 4)),
                                 ZEXT416(*(uint *)(puVar35 + uVar21 * 4)));
              auVar98._0_2_ = auVar76._0_2_ * sVar93 + sVar138 * sVar37 + sVar116;
              auVar98._2_2_ = auVar76._2_2_ * sVar102 + sVar141 * sVar40 + sVar60;
              auVar98._4_2_ = auVar76._4_2_ * sVar104 + sVar138 * sVar41 + sVar121;
              auVar98._6_2_ = auVar76._6_2_ * sVar106 + sVar141 * sVar42 + sVar130;
              auVar98._8_2_ = auVar76._8_2_ * sVar108 + sVar138 * sVar43 + sVar131;
              auVar98._10_2_ = auVar76._10_2_ * sVar110 + sVar141 * sVar44 + sVar134;
              auVar98._12_2_ = auVar76._12_2_ * sVar112 + sVar138 * sVar45 + sVar135;
              auVar98._14_2_ = auVar76._14_2_ * sVar114 + sVar141 * sVar46 + sVar137;
              auVar76 = pmulhuw(auVar98,auVar16);
              sVar94 = auVar76._0_2_;
              sVar103 = auVar76._2_2_;
              sVar105 = auVar76._4_2_;
              sVar107 = auVar76._6_2_;
              *(uint *)(puVar35 + uVar21 * 4) =
                   CONCAT13((0 < sVar107) * (sVar107 < 0x100) * auVar76[6] - (0xff < sVar107),
                            CONCAT12((0 < sVar105) * (sVar105 < 0x100) * auVar76[4] -
                                     (0xff < sVar105),
                                     CONCAT11((0 < sVar103) * (sVar103 < 0x100) * auVar76[2] -
                                              (0xff < sVar103),
                                              (0 < sVar94) * (sVar94 < 0x100) * auVar76[0] -
                                              (0xff < sVar94))));
            }
          }
          else {
            puVar26 = (uint32_t *)(puVar35 + uVar21 * 4);
            for (uVar23 = uVar24; 7 < uVar23; uVar23 = uVar23 - 8) {
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x10) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x20) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x30) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x40) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x50) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x60) = auVar39;
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4 + 0x70) = auVar39;
              uVar21 = uVar21 + 0x20;
              puVar26 = puVar26 + 0x20;
            }
            lVar25 = uVar24 - (uVar30 >> 2 & 0x3ffffffffffffff8);
            while (bVar36 = lVar25 != 0, lVar25 = lVar25 + -1, bVar36) {
              *(undefined1 (*) [16])(puVar35 + uVar21 * 4) = auVar39;
              uVar21 = uVar21 + 4;
              puVar26 = puVar26 + 4;
            }
            for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
              *puVar26 = uVar17;
              puVar26 = puVar26 + 1;
            }
          }
        }
      }
      puVar35 = puVar35 + lVar6;
      pCVar34 = pCVar34 + self->_cellStride;
    }
    (self->_yBounds).start = 0x7fffffff;
    (self->_yBounds).end = 0;
    return;
  }
  RasterizerA3<8u>::_renderImpl<CompositorScalar,true>((RasterizerA3<8u> *)self,argb32);
  return;
}

Assistant:

inline bool hasOption(uint32_t option) const noexcept { return (_options & option) != 0; }